

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_16,_16777232,_false,_embree::avx512::SubdivPatch1MBIntersectorK<16>,_true>
     ::occluded(vint<16> *valid_i,Intersectors *This,RayK<16> *ray,RayQueryContext *context)

{
  RayK<16> *pRVar1;
  Geometry *pGVar2;
  RTCRayQueryContext *pRVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  byte bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [32];
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  size_t k;
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  uint uVar42;
  long lVar43;
  bool bVar44;
  ushort uVar45;
  uint uVar46;
  uint uVar47;
  AABBNodeMB4D *node1;
  ulong uVar48;
  GridSOA *pGVar49;
  long lVar50;
  uint uVar51;
  long lVar52;
  ulong uVar53;
  long lVar54;
  long lVar55;
  ulong *puVar56;
  GridSOA *pGVar57;
  undefined1 (*pauVar58) [64];
  Primitive_conflict3 *prim;
  NodeRef root;
  long lVar59;
  undefined4 uVar60;
  ulong uVar61;
  long lVar62;
  long lVar63;
  GridSOA *pGVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  int iVar68;
  undefined1 auVar69 [16];
  int iVar115;
  int iVar116;
  int iVar118;
  int iVar119;
  int iVar120;
  int iVar121;
  int iVar122;
  int iVar123;
  int iVar124;
  int iVar125;
  int iVar126;
  int iVar127;
  int iVar128;
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  int iVar117;
  int iVar129;
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar130 [64];
  undefined1 in_ZMM2 [64];
  undefined1 in_ZMM11 [64];
  undefined1 in_ZMM29 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  vfloat<16> t;
  vfloat<16> v;
  vfloat<16> u;
  vint<16> vitime;
  Vec3vf<16> Ng;
  TravRayK<16,_false> tray;
  NodeRef stack_node [241];
  vfloat<16> stack_near [241];
  uint local_54fc;
  uint local_54cc;
  ushort local_54c8;
  GridSOA *local_54b8;
  GridSOA *local_54b0;
  Precalculations local_5498;
  undefined1 (*local_5488) [32];
  long local_5480;
  GridSOA *local_5478;
  GridSOA *local_5470;
  GridSOA *local_5468;
  GridSOA *local_5460;
  GridSOA *local_5458;
  GridSOA *local_5450;
  GridSOA *local_5448;
  GridSOA *local_5440;
  GridSOA *local_5438;
  RTCFilterFunctionNArguments local_5430;
  undefined1 local_5400 [16];
  _Head_base<1UL,_embree::vfloat_impl<16>_&,_false> _Stack_53f0;
  _Head_base<0UL,_embree::vfloat_impl<16>_&,_false> _Stack_53e8;
  undefined1 auStack_53e0 [32];
  BVH *local_5388;
  Intersectors *local_5380;
  undefined1 (*local_5378) [64];
  ulong *local_5370;
  long local_5368;
  long local_5360;
  long local_5358;
  long local_5350;
  GridSOA *local_5348;
  undefined1 local_5340 [64];
  undefined1 local_5300 [64];
  undefined1 local_52c0 [64];
  undefined1 local_5280 [64];
  undefined1 local_5240 [64];
  undefined1 local_5200 [64];
  undefined1 local_51c0 [64];
  undefined1 local_5180 [64];
  undefined1 local_5140 [64];
  undefined8 local_5100;
  undefined8 uStack_50f8;
  undefined8 uStack_50f0;
  undefined8 uStack_50e8;
  undefined8 uStack_50e0;
  undefined8 uStack_50d8;
  undefined8 uStack_50d0;
  undefined8 uStack_50c8;
  anon_union_192_2_4062524c_for_Vec3<embree::vfloat_impl<16>_>_1 local_50c0;
  undefined8 local_5000;
  undefined8 uStack_4ff8;
  undefined8 uStack_4ff0;
  undefined8 uStack_4fe8;
  undefined8 uStack_4fe0;
  undefined8 uStack_4fd8;
  undefined8 uStack_4fd0;
  undefined8 uStack_4fc8;
  undefined1 local_4fc0 [64];
  undefined1 local_4f80 [64];
  undefined1 local_4f40 [64];
  undefined1 local_4f00 [64];
  undefined1 local_4ec0 [64];
  undefined1 local_4e80 [64];
  undefined8 local_4e40;
  undefined8 uStack_4e38;
  undefined8 uStack_4e30;
  undefined8 uStack_4e28;
  undefined8 uStack_4e20;
  undefined8 uStack_4e18;
  undefined8 uStack_4e10;
  undefined8 uStack_4e08;
  undefined8 local_4e00;
  undefined8 uStack_4df8;
  undefined8 uStack_4df0;
  undefined8 uStack_4de8;
  undefined8 uStack_4de0;
  undefined8 uStack_4dd8;
  undefined8 uStack_4dd0;
  undefined8 uStack_4dc8;
  undefined8 local_4dc0;
  undefined8 uStack_4db8;
  undefined8 uStack_4db0;
  undefined8 uStack_4da8;
  undefined8 uStack_4da0;
  undefined8 uStack_4d98;
  undefined8 uStack_4d90;
  undefined8 uStack_4d88;
  undefined1 local_4d80 [64];
  undefined1 local_4d40 [64];
  undefined1 local_4d00 [64];
  undefined1 local_4cc0 [64];
  undefined1 local_4c80 [64];
  undefined1 local_4c40 [64];
  undefined1 local_4c00 [64];
  undefined1 local_4bc0 [64];
  undefined1 local_4b80 [64];
  undefined1 local_4b40 [64];
  undefined1 local_4b00 [64];
  undefined1 local_4ac0 [64];
  undefined1 local_4a80 [64];
  undefined1 local_4a40 [64];
  undefined1 local_4a00 [64];
  undefined1 local_49c0 [64];
  undefined1 local_4980 [64];
  undefined1 local_4940 [64];
  undefined1 local_4900 [64];
  anon_union_192_2_4062524c_for_Vec3<embree::vfloat_impl<16>_>_1 local_48c0;
  undefined1 local_4800 [64];
  undefined1 local_47c0 [64];
  undefined1 local_4780 [64];
  undefined1 local_4740 [64];
  undefined1 local_4700 [64];
  undefined1 local_46c0 [64];
  undefined1 local_4680 [64];
  undefined1 local_4640 [64];
  undefined1 local_4600 [64];
  undefined1 local_45c0 [64];
  undefined1 local_4580 [64];
  undefined1 local_4540 [64];
  uint local_4500;
  uint uStack_44fc;
  uint uStack_44f8;
  uint uStack_44f4;
  uint uStack_44f0;
  uint uStack_44ec;
  uint uStack_44e8;
  uint uStack_44e4;
  uint uStack_44e0;
  uint uStack_44dc;
  uint uStack_44d8;
  uint uStack_44d4;
  uint uStack_44d0;
  uint uStack_44cc;
  uint uStack_44c8;
  uint uStack_44c4;
  uint local_44c0;
  uint uStack_44bc;
  uint uStack_44b8;
  uint uStack_44b4;
  uint uStack_44b0;
  uint uStack_44ac;
  uint uStack_44a8;
  uint uStack_44a4;
  uint uStack_44a0;
  uint uStack_449c;
  uint uStack_4498;
  uint uStack_4494;
  uint uStack_4490;
  uint uStack_448c;
  uint uStack_4488;
  uint uStack_4484;
  undefined8 local_4450;
  size_t local_4448;
  ulong local_4440 [240];
  undefined1 local_3cc0 [64];
  uint local_3c80;
  uint uStack_3c7c;
  uint uStack_3c78;
  uint uStack_3c74;
  uint uStack_3c70;
  uint uStack_3c6c;
  uint uStack_3c68;
  uint uStack_3c64;
  uint uStack_3c60;
  uint uStack_3c5c;
  uint uStack_3c58;
  uint uStack_3c54;
  uint uStack_3c50;
  uint uStack_3c4c;
  uint uStack_3c48;
  uint uStack_3c44;
  undefined1 local_3c40 [15376];
  
  local_5388 = (BVH *)This->ptr;
  local_4448 = (local_5388->root).ptr;
  if (local_4448 != 8) {
    auVar70 = vpternlogd_avx512f(in_ZMM2,in_ZMM2,in_ZMM2,0xff);
    auVar130 = ZEXT1664(ZEXT816(0) << 0x40);
    uVar65 = vcmpps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar130,5);
    uVar48 = vpcmpeqd_avx512f(auVar70,(undefined1  [64])valid_i->field_0);
    uVar65 = uVar65 & uVar48;
    if ((ushort)uVar65 != 0) {
      local_5498.super_Precalculations.grid = (GridSOA *)0x0;
      local_48c0.field_0.x.field_0 =
           (vfloat_impl<16>)(vfloat_impl<16>)*(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)ray;
      local_48c0.field_0.y.field_0 =
           (vfloat_impl<16>)
           (vfloat_impl<16>)*(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)(ray + 0x40);
      local_48c0.field_0.z.field_0 =
           (vfloat_impl<16>)
           (vfloat_impl<16>)*(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)(ray + 0x80);
      local_4800 = *(undefined1 (*) [64])(ray + 0x100);
      local_47c0 = *(undefined1 (*) [64])(ray + 0x140);
      local_4780 = *(undefined1 (*) [64])(ray + 0x180);
      auVar70 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
      auVar71 = vandps_avx512dq(local_4800,auVar70);
      auVar72 = vbroadcastss_avx512f(ZEXT416(0x219392ef));
      uVar48 = vcmpps_avx512f(auVar71,auVar72,1);
      bVar44 = (bool)((byte)uVar48 & 1);
      iVar68 = auVar72._0_4_;
      auVar71._0_4_ = (uint)bVar44 * iVar68 | (uint)!bVar44 * local_4800._0_4_;
      bVar44 = (bool)((byte)(uVar48 >> 1) & 1);
      iVar115 = auVar72._4_4_;
      auVar71._4_4_ = (uint)bVar44 * iVar115 | (uint)!bVar44 * local_4800._4_4_;
      bVar44 = (bool)((byte)(uVar48 >> 2) & 1);
      iVar116 = auVar72._8_4_;
      auVar71._8_4_ = (uint)bVar44 * iVar116 | (uint)!bVar44 * local_4800._8_4_;
      bVar44 = (bool)((byte)(uVar48 >> 3) & 1);
      iVar117 = auVar72._12_4_;
      auVar71._12_4_ = (uint)bVar44 * iVar117 | (uint)!bVar44 * local_4800._12_4_;
      bVar44 = (bool)((byte)(uVar48 >> 4) & 1);
      iVar118 = auVar72._16_4_;
      auVar71._16_4_ = (uint)bVar44 * iVar118 | (uint)!bVar44 * local_4800._16_4_;
      bVar44 = (bool)((byte)(uVar48 >> 5) & 1);
      iVar119 = auVar72._20_4_;
      auVar71._20_4_ = (uint)bVar44 * iVar119 | (uint)!bVar44 * local_4800._20_4_;
      bVar44 = (bool)((byte)(uVar48 >> 6) & 1);
      iVar120 = auVar72._24_4_;
      auVar71._24_4_ = (uint)bVar44 * iVar120 | (uint)!bVar44 * local_4800._24_4_;
      bVar44 = (bool)((byte)(uVar48 >> 7) & 1);
      iVar121 = auVar72._28_4_;
      auVar71._28_4_ = (uint)bVar44 * iVar121 | (uint)!bVar44 * local_4800._28_4_;
      bVar44 = (bool)((byte)(uVar48 >> 8) & 1);
      iVar122 = auVar72._32_4_;
      auVar71._32_4_ = (uint)bVar44 * iVar122 | (uint)!bVar44 * local_4800._32_4_;
      bVar44 = (bool)((byte)(uVar48 >> 9) & 1);
      iVar123 = auVar72._36_4_;
      auVar71._36_4_ = (uint)bVar44 * iVar123 | (uint)!bVar44 * local_4800._36_4_;
      bVar44 = (bool)((byte)(uVar48 >> 10) & 1);
      iVar124 = auVar72._40_4_;
      auVar71._40_4_ = (uint)bVar44 * iVar124 | (uint)!bVar44 * local_4800._40_4_;
      bVar44 = (bool)((byte)(uVar48 >> 0xb) & 1);
      iVar125 = auVar72._44_4_;
      auVar71._44_4_ = (uint)bVar44 * iVar125 | (uint)!bVar44 * local_4800._44_4_;
      bVar44 = (bool)((byte)(uVar48 >> 0xc) & 1);
      iVar126 = auVar72._48_4_;
      auVar71._48_4_ = (uint)bVar44 * iVar126 | (uint)!bVar44 * local_4800._48_4_;
      bVar44 = (bool)((byte)(uVar48 >> 0xd) & 1);
      iVar127 = auVar72._52_4_;
      auVar71._52_4_ = (uint)bVar44 * iVar127 | (uint)!bVar44 * local_4800._52_4_;
      bVar44 = (bool)((byte)(uVar48 >> 0xe) & 1);
      iVar128 = auVar72._56_4_;
      iVar129 = auVar72._60_4_;
      auVar71._56_4_ = (uint)bVar44 * iVar128 | (uint)!bVar44 * local_4800._56_4_;
      bVar44 = SUB81(uVar48 >> 0xf,0);
      auVar71._60_4_ = (uint)bVar44 * iVar129 | (uint)!bVar44 * local_4800._60_4_;
      auVar73 = vandps_avx512dq(local_47c0,auVar70);
      uVar48 = vcmpps_avx512f(auVar73,auVar72,1);
      bVar44 = (bool)((byte)uVar48 & 1);
      auVar73._0_4_ = (uint)bVar44 * iVar68 | (uint)!bVar44 * local_47c0._0_4_;
      bVar44 = (bool)((byte)(uVar48 >> 1) & 1);
      auVar73._4_4_ = (uint)bVar44 * iVar115 | (uint)!bVar44 * local_47c0._4_4_;
      bVar44 = (bool)((byte)(uVar48 >> 2) & 1);
      auVar73._8_4_ = (uint)bVar44 * iVar116 | (uint)!bVar44 * local_47c0._8_4_;
      bVar44 = (bool)((byte)(uVar48 >> 3) & 1);
      auVar73._12_4_ = (uint)bVar44 * iVar117 | (uint)!bVar44 * local_47c0._12_4_;
      bVar44 = (bool)((byte)(uVar48 >> 4) & 1);
      auVar73._16_4_ = (uint)bVar44 * iVar118 | (uint)!bVar44 * local_47c0._16_4_;
      bVar44 = (bool)((byte)(uVar48 >> 5) & 1);
      auVar73._20_4_ = (uint)bVar44 * iVar119 | (uint)!bVar44 * local_47c0._20_4_;
      bVar44 = (bool)((byte)(uVar48 >> 6) & 1);
      auVar73._24_4_ = (uint)bVar44 * iVar120 | (uint)!bVar44 * local_47c0._24_4_;
      bVar44 = (bool)((byte)(uVar48 >> 7) & 1);
      auVar73._28_4_ = (uint)bVar44 * iVar121 | (uint)!bVar44 * local_47c0._28_4_;
      bVar44 = (bool)((byte)(uVar48 >> 8) & 1);
      auVar73._32_4_ = (uint)bVar44 * iVar122 | (uint)!bVar44 * local_47c0._32_4_;
      bVar44 = (bool)((byte)(uVar48 >> 9) & 1);
      auVar73._36_4_ = (uint)bVar44 * iVar123 | (uint)!bVar44 * local_47c0._36_4_;
      bVar44 = (bool)((byte)(uVar48 >> 10) & 1);
      auVar73._40_4_ = (uint)bVar44 * iVar124 | (uint)!bVar44 * local_47c0._40_4_;
      bVar44 = (bool)((byte)(uVar48 >> 0xb) & 1);
      auVar73._44_4_ = (uint)bVar44 * iVar125 | (uint)!bVar44 * local_47c0._44_4_;
      bVar44 = (bool)((byte)(uVar48 >> 0xc) & 1);
      auVar73._48_4_ = (uint)bVar44 * iVar126 | (uint)!bVar44 * local_47c0._48_4_;
      bVar44 = (bool)((byte)(uVar48 >> 0xd) & 1);
      auVar73._52_4_ = (uint)bVar44 * iVar127 | (uint)!bVar44 * local_47c0._52_4_;
      bVar44 = (bool)((byte)(uVar48 >> 0xe) & 1);
      auVar73._56_4_ = (uint)bVar44 * iVar128 | (uint)!bVar44 * local_47c0._56_4_;
      bVar44 = SUB81(uVar48 >> 0xf,0);
      auVar73._60_4_ = (uint)bVar44 * iVar129 | (uint)!bVar44 * local_47c0._60_4_;
      auVar74 = vandps_avx512dq(local_4780,auVar70);
      uVar48 = vcmpps_avx512f(auVar74,auVar72,1);
      auVar72 = vrcp14ps_avx512f(auVar71);
      bVar44 = (bool)((byte)uVar48 & 1);
      auVar74._0_4_ = (uint)bVar44 * iVar68 | (uint)!bVar44 * local_4780._0_4_;
      bVar44 = (bool)((byte)(uVar48 >> 1) & 1);
      auVar74._4_4_ = (uint)bVar44 * iVar115 | (uint)!bVar44 * local_4780._4_4_;
      bVar44 = (bool)((byte)(uVar48 >> 2) & 1);
      auVar74._8_4_ = (uint)bVar44 * iVar116 | (uint)!bVar44 * local_4780._8_4_;
      bVar44 = (bool)((byte)(uVar48 >> 3) & 1);
      auVar74._12_4_ = (uint)bVar44 * iVar117 | (uint)!bVar44 * local_4780._12_4_;
      bVar44 = (bool)((byte)(uVar48 >> 4) & 1);
      auVar74._16_4_ = (uint)bVar44 * iVar118 | (uint)!bVar44 * local_4780._16_4_;
      bVar44 = (bool)((byte)(uVar48 >> 5) & 1);
      auVar74._20_4_ = (uint)bVar44 * iVar119 | (uint)!bVar44 * local_4780._20_4_;
      bVar44 = (bool)((byte)(uVar48 >> 6) & 1);
      auVar74._24_4_ = (uint)bVar44 * iVar120 | (uint)!bVar44 * local_4780._24_4_;
      bVar44 = (bool)((byte)(uVar48 >> 7) & 1);
      auVar74._28_4_ = (uint)bVar44 * iVar121 | (uint)!bVar44 * local_4780._28_4_;
      bVar44 = (bool)((byte)(uVar48 >> 8) & 1);
      auVar74._32_4_ = (uint)bVar44 * iVar122 | (uint)!bVar44 * local_4780._32_4_;
      bVar44 = (bool)((byte)(uVar48 >> 9) & 1);
      auVar74._36_4_ = (uint)bVar44 * iVar123 | (uint)!bVar44 * local_4780._36_4_;
      bVar44 = (bool)((byte)(uVar48 >> 10) & 1);
      auVar74._40_4_ = (uint)bVar44 * iVar124 | (uint)!bVar44 * local_4780._40_4_;
      bVar44 = (bool)((byte)(uVar48 >> 0xb) & 1);
      auVar74._44_4_ = (uint)bVar44 * iVar125 | (uint)!bVar44 * local_4780._44_4_;
      bVar44 = (bool)((byte)(uVar48 >> 0xc) & 1);
      auVar74._48_4_ = (uint)bVar44 * iVar126 | (uint)!bVar44 * local_4780._48_4_;
      bVar44 = (bool)((byte)(uVar48 >> 0xd) & 1);
      auVar74._52_4_ = (uint)bVar44 * iVar127 | (uint)!bVar44 * local_4780._52_4_;
      bVar44 = (bool)((byte)(uVar48 >> 0xe) & 1);
      auVar74._56_4_ = (uint)bVar44 * iVar128 | (uint)!bVar44 * local_4780._56_4_;
      bVar44 = SUB81(uVar48 >> 0xf,0);
      auVar74._60_4_ = (uint)bVar44 * iVar129 | (uint)!bVar44 * local_4780._60_4_;
      auVar75 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar76 = vrcp14ps_avx512f(auVar73);
      auVar71 = vfnmadd213ps_avx512f(auVar71,auVar72,auVar75);
      local_4740 = vfmadd132ps_avx512f(auVar71,auVar72,auVar72);
      auVar71 = vfnmadd213ps_avx512f(auVar73,auVar76,auVar75);
      auVar72 = vrcp14ps_avx512f(auVar74);
      local_4700 = vfmadd132ps_avx512f(auVar71,auVar76,auVar76);
      auVar71 = vfnmadd213ps_avx512f(auVar74,auVar72,auVar75);
      local_46c0 = vfmadd132ps_avx512f(auVar71,auVar72,auVar72);
      local_4680 = vmulps_avx512f((undefined1  [64])
                                  *(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)ray,local_4740)
      ;
      local_4640 = vmulps_avx512f((undefined1  [64])
                                  *(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)(ray + 0x40),
                                  local_4700);
      local_4600 = vmulps_avx512f((undefined1  [64])
                                  *(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)(ray + 0x80),
                                  local_46c0);
      uVar48 = vcmpps_avx512f(local_4740,auVar130,1);
      auVar71 = vpbroadcastd_avx512f(ZEXT416(0x10));
      auVar72._4_4_ = (uint)((byte)(uVar48 >> 1) & 1) * auVar71._4_4_;
      auVar72._0_4_ = (uint)((byte)uVar48 & 1) * auVar71._0_4_;
      auVar72._8_4_ = (uint)((byte)(uVar48 >> 2) & 1) * auVar71._8_4_;
      auVar72._12_4_ = (uint)((byte)(uVar48 >> 3) & 1) * auVar71._12_4_;
      auVar72._16_4_ = (uint)((byte)(uVar48 >> 4) & 1) * auVar71._16_4_;
      auVar72._20_4_ = (uint)((byte)(uVar48 >> 5) & 1) * auVar71._20_4_;
      auVar72._24_4_ = (uint)((byte)(uVar48 >> 6) & 1) * auVar71._24_4_;
      auVar72._28_4_ = (uint)((byte)(uVar48 >> 7) & 1) * auVar71._28_4_;
      auVar72._32_4_ = (uint)((byte)(uVar48 >> 8) & 1) * auVar71._32_4_;
      auVar72._36_4_ = (uint)((byte)(uVar48 >> 9) & 1) * auVar71._36_4_;
      auVar72._40_4_ = (uint)((byte)(uVar48 >> 10) & 1) * auVar71._40_4_;
      auVar72._44_4_ = (uint)((byte)(uVar48 >> 0xb) & 1) * auVar71._44_4_;
      auVar72._48_4_ = (uint)((byte)(uVar48 >> 0xc) & 1) * auVar71._48_4_;
      auVar72._52_4_ = (uint)((byte)(uVar48 >> 0xd) & 1) * auVar71._52_4_;
      auVar72._56_4_ = (uint)((byte)(uVar48 >> 0xe) & 1) * auVar71._56_4_;
      auVar72._60_4_ = (uint)(byte)(uVar48 >> 0xf) * auVar71._60_4_;
      local_45c0 = vmovdqa64_avx512f(auVar72);
      uVar48 = vcmpps_avx512f(local_4700,auVar130,5);
      auVar71 = vpbroadcastd_avx512f(ZEXT416(0x30));
      auVar72 = vpbroadcastd_avx512f(ZEXT416(0x20));
      bVar44 = (bool)((byte)uVar48 & 1);
      auVar75._0_4_ = (uint)bVar44 * auVar72._0_4_ | (uint)!bVar44 * auVar71._0_4_;
      bVar44 = (bool)((byte)(uVar48 >> 1) & 1);
      auVar75._4_4_ = (uint)bVar44 * auVar72._4_4_ | (uint)!bVar44 * auVar71._4_4_;
      bVar44 = (bool)((byte)(uVar48 >> 2) & 1);
      auVar75._8_4_ = (uint)bVar44 * auVar72._8_4_ | (uint)!bVar44 * auVar71._8_4_;
      bVar44 = (bool)((byte)(uVar48 >> 3) & 1);
      auVar75._12_4_ = (uint)bVar44 * auVar72._12_4_ | (uint)!bVar44 * auVar71._12_4_;
      bVar44 = (bool)((byte)(uVar48 >> 4) & 1);
      auVar75._16_4_ = (uint)bVar44 * auVar72._16_4_ | (uint)!bVar44 * auVar71._16_4_;
      bVar44 = (bool)((byte)(uVar48 >> 5) & 1);
      auVar75._20_4_ = (uint)bVar44 * auVar72._20_4_ | (uint)!bVar44 * auVar71._20_4_;
      bVar44 = (bool)((byte)(uVar48 >> 6) & 1);
      auVar75._24_4_ = (uint)bVar44 * auVar72._24_4_ | (uint)!bVar44 * auVar71._24_4_;
      bVar44 = (bool)((byte)(uVar48 >> 7) & 1);
      auVar75._28_4_ = (uint)bVar44 * auVar72._28_4_ | (uint)!bVar44 * auVar71._28_4_;
      bVar44 = (bool)((byte)(uVar48 >> 8) & 1);
      auVar75._32_4_ = (uint)bVar44 * auVar72._32_4_ | (uint)!bVar44 * auVar71._32_4_;
      bVar44 = (bool)((byte)(uVar48 >> 9) & 1);
      auVar75._36_4_ = (uint)bVar44 * auVar72._36_4_ | (uint)!bVar44 * auVar71._36_4_;
      bVar44 = (bool)((byte)(uVar48 >> 10) & 1);
      auVar75._40_4_ = (uint)bVar44 * auVar72._40_4_ | (uint)!bVar44 * auVar71._40_4_;
      bVar44 = (bool)((byte)(uVar48 >> 0xb) & 1);
      auVar75._44_4_ = (uint)bVar44 * auVar72._44_4_ | (uint)!bVar44 * auVar71._44_4_;
      bVar44 = (bool)((byte)(uVar48 >> 0xc) & 1);
      auVar75._48_4_ = (uint)bVar44 * auVar72._48_4_ | (uint)!bVar44 * auVar71._48_4_;
      bVar44 = (bool)((byte)(uVar48 >> 0xd) & 1);
      auVar75._52_4_ = (uint)bVar44 * auVar72._52_4_ | (uint)!bVar44 * auVar71._52_4_;
      bVar44 = (bool)((byte)(uVar48 >> 0xe) & 1);
      auVar75._56_4_ = (uint)bVar44 * auVar72._56_4_ | (uint)!bVar44 * auVar71._56_4_;
      bVar44 = SUB81(uVar48 >> 0xf,0);
      auVar75._60_4_ = (uint)bVar44 * auVar72._60_4_ | (uint)!bVar44 * auVar71._60_4_;
      local_4580 = vmovdqa64_avx512f(auVar75);
      uVar48 = vcmpps_avx512f(local_46c0,auVar130,5);
      auVar71 = vpbroadcastd_avx512f(ZEXT416(0x50));
      auVar72 = vpbroadcastd_avx512f(ZEXT416(0x40));
      bVar44 = (bool)((byte)uVar48 & 1);
      auVar76._0_4_ = (uint)bVar44 * auVar72._0_4_ | (uint)!bVar44 * auVar71._0_4_;
      bVar44 = (bool)((byte)(uVar48 >> 1) & 1);
      auVar76._4_4_ = (uint)bVar44 * auVar72._4_4_ | (uint)!bVar44 * auVar71._4_4_;
      bVar44 = (bool)((byte)(uVar48 >> 2) & 1);
      auVar76._8_4_ = (uint)bVar44 * auVar72._8_4_ | (uint)!bVar44 * auVar71._8_4_;
      bVar44 = (bool)((byte)(uVar48 >> 3) & 1);
      auVar76._12_4_ = (uint)bVar44 * auVar72._12_4_ | (uint)!bVar44 * auVar71._12_4_;
      bVar44 = (bool)((byte)(uVar48 >> 4) & 1);
      auVar76._16_4_ = (uint)bVar44 * auVar72._16_4_ | (uint)!bVar44 * auVar71._16_4_;
      bVar44 = (bool)((byte)(uVar48 >> 5) & 1);
      auVar76._20_4_ = (uint)bVar44 * auVar72._20_4_ | (uint)!bVar44 * auVar71._20_4_;
      bVar44 = (bool)((byte)(uVar48 >> 6) & 1);
      auVar76._24_4_ = (uint)bVar44 * auVar72._24_4_ | (uint)!bVar44 * auVar71._24_4_;
      bVar44 = (bool)((byte)(uVar48 >> 7) & 1);
      auVar76._28_4_ = (uint)bVar44 * auVar72._28_4_ | (uint)!bVar44 * auVar71._28_4_;
      bVar44 = (bool)((byte)(uVar48 >> 8) & 1);
      auVar76._32_4_ = (uint)bVar44 * auVar72._32_4_ | (uint)!bVar44 * auVar71._32_4_;
      bVar44 = (bool)((byte)(uVar48 >> 9) & 1);
      auVar76._36_4_ = (uint)bVar44 * auVar72._36_4_ | (uint)!bVar44 * auVar71._36_4_;
      bVar44 = (bool)((byte)(uVar48 >> 10) & 1);
      auVar76._40_4_ = (uint)bVar44 * auVar72._40_4_ | (uint)!bVar44 * auVar71._40_4_;
      bVar44 = (bool)((byte)(uVar48 >> 0xb) & 1);
      auVar76._44_4_ = (uint)bVar44 * auVar72._44_4_ | (uint)!bVar44 * auVar71._44_4_;
      bVar44 = (bool)((byte)(uVar48 >> 0xc) & 1);
      auVar76._48_4_ = (uint)bVar44 * auVar72._48_4_ | (uint)!bVar44 * auVar71._48_4_;
      bVar44 = (bool)((byte)(uVar48 >> 0xd) & 1);
      auVar76._52_4_ = (uint)bVar44 * auVar72._52_4_ | (uint)!bVar44 * auVar71._52_4_;
      bVar44 = (bool)((byte)(uVar48 >> 0xe) & 1);
      auVar76._56_4_ = (uint)bVar44 * auVar72._56_4_ | (uint)!bVar44 * auVar71._56_4_;
      bVar44 = SUB81(uVar48 >> 0xf,0);
      auVar76._60_4_ = (uint)bVar44 * auVar72._60_4_ | (uint)!bVar44 * auVar71._60_4_;
      local_4540 = vmovdqa64_avx512f(auVar76);
      auVar72 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
      auVar71 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0xc0),auVar130);
      bVar44 = (bool)((byte)uVar65 & 1);
      local_4500 = (uint)bVar44 * auVar71._0_4_ | (uint)!bVar44 * auVar72._0_4_;
      bVar44 = (bool)((byte)(uVar65 >> 1) & 1);
      uStack_44fc = (uint)bVar44 * auVar71._4_4_ | (uint)!bVar44 * auVar72._4_4_;
      bVar44 = (bool)((byte)(uVar65 >> 2) & 1);
      uStack_44f8 = (uint)bVar44 * auVar71._8_4_ | (uint)!bVar44 * auVar72._8_4_;
      bVar44 = (bool)((byte)(uVar65 >> 3) & 1);
      uStack_44f4 = (uint)bVar44 * auVar71._12_4_ | (uint)!bVar44 * auVar72._12_4_;
      bVar44 = (bool)((byte)(uVar65 >> 4) & 1);
      uStack_44f0 = (uint)bVar44 * auVar71._16_4_ | (uint)!bVar44 * auVar72._16_4_;
      bVar44 = (bool)((byte)(uVar65 >> 5) & 1);
      uStack_44ec = (uint)bVar44 * auVar71._20_4_ | (uint)!bVar44 * auVar72._20_4_;
      bVar44 = (bool)((byte)(uVar65 >> 6) & 1);
      uStack_44e8 = (uint)bVar44 * auVar71._24_4_ | (uint)!bVar44 * auVar72._24_4_;
      bVar44 = (bool)((byte)(uVar65 >> 7) & 1);
      uStack_44e4 = (uint)bVar44 * auVar71._28_4_ | (uint)!bVar44 * auVar72._28_4_;
      bVar12 = (byte)(uVar65 >> 8);
      bVar44 = (bool)(bVar12 & 1);
      uStack_44e0 = (uint)bVar44 * auVar71._32_4_ | (uint)!bVar44 * auVar72._32_4_;
      bVar44 = (bool)((byte)(uVar65 >> 9) & 1);
      uStack_44dc = (uint)bVar44 * auVar71._36_4_ | (uint)!bVar44 * auVar72._36_4_;
      bVar44 = (bool)((byte)(uVar65 >> 10) & 1);
      uStack_44d8 = (uint)bVar44 * auVar71._40_4_ | (uint)!bVar44 * auVar72._40_4_;
      bVar44 = (bool)((byte)(uVar65 >> 0xb) & 1);
      uStack_44d4 = (uint)bVar44 * auVar71._44_4_ | (uint)!bVar44 * auVar72._44_4_;
      bVar44 = (bool)((byte)(uVar65 >> 0xc) & 1);
      uStack_44d0 = (uint)bVar44 * auVar71._48_4_ | (uint)!bVar44 * auVar72._48_4_;
      bVar44 = (bool)((byte)(uVar65 >> 0xd) & 1);
      uStack_44cc = (uint)bVar44 * auVar71._52_4_ | (uint)!bVar44 * auVar72._52_4_;
      bVar44 = (bool)((byte)(uVar65 >> 0xe) & 1);
      uStack_44c8 = (uint)bVar44 * auVar71._56_4_ | (uint)!bVar44 * auVar72._56_4_;
      bVar44 = SUB81(uVar65 >> 0xf,0);
      uStack_44c4 = (uint)bVar44 * auVar71._60_4_ | (uint)!bVar44 * auVar72._60_4_;
      auVar71 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      auVar130 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar130);
      bVar44 = (bool)((byte)uVar65 & 1);
      bVar5 = (bool)((byte)(uVar65 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar65 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar65 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar65 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar65 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar65 >> 6) & 1);
      bVar11 = (bool)((byte)(uVar65 >> 7) & 1);
      bVar13 = (bool)(bVar12 & 1);
      bVar14 = (bool)((byte)(uVar65 >> 9) & 1);
      bVar15 = (bool)((byte)(uVar65 >> 10) & 1);
      bVar16 = (bool)((byte)(uVar65 >> 0xb) & 1);
      bVar17 = (bool)((byte)(uVar65 >> 0xc) & 1);
      bVar18 = (bool)((byte)(uVar65 >> 0xd) & 1);
      bVar19 = (bool)((byte)(uVar65 >> 0xe) & 1);
      bVar20 = SUB81(uVar65 >> 0xf,0);
      local_44c0 = (uint)bVar44 * auVar130._0_4_ | (uint)!bVar44 * auVar71._0_4_;
      uStack_44bc = (uint)bVar5 * auVar130._4_4_ | (uint)!bVar5 * auVar71._4_4_;
      uStack_44b8 = (uint)bVar6 * auVar130._8_4_ | (uint)!bVar6 * auVar71._8_4_;
      uStack_44b4 = (uint)bVar7 * auVar130._12_4_ | (uint)!bVar7 * auVar71._12_4_;
      uStack_44b0 = (uint)bVar8 * auVar130._16_4_ | (uint)!bVar8 * auVar71._16_4_;
      uStack_44ac = (uint)bVar9 * auVar130._20_4_ | (uint)!bVar9 * auVar71._20_4_;
      uStack_44a8 = (uint)bVar10 * auVar130._24_4_ | (uint)!bVar10 * auVar71._24_4_;
      uStack_44a4 = (uint)bVar11 * auVar130._28_4_ | (uint)!bVar11 * auVar71._28_4_;
      uStack_44a0 = (uint)bVar13 * auVar130._32_4_ | (uint)!bVar13 * auVar71._32_4_;
      uStack_449c = (uint)bVar14 * auVar130._36_4_ | (uint)!bVar14 * auVar71._36_4_;
      uStack_4498 = (uint)bVar15 * auVar130._40_4_ | (uint)!bVar15 * auVar71._40_4_;
      uStack_4494 = (uint)bVar16 * auVar130._44_4_ | (uint)!bVar16 * auVar71._44_4_;
      uStack_4490 = (uint)bVar17 * auVar130._48_4_ | (uint)!bVar17 * auVar71._48_4_;
      uStack_448c = (uint)bVar18 * auVar130._52_4_ | (uint)!bVar18 * auVar71._52_4_;
      uStack_4488 = (uint)bVar19 * auVar130._56_4_ | (uint)!bVar19 * auVar71._56_4_;
      uStack_4484 = (uint)bVar20 * auVar130._60_4_ | (uint)!bVar20 * auVar71._60_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar42 = 0xe;
      }
      else {
        uVar42 = 2;
        if ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT) {
          uVar42 = 0xe;
        }
      }
      local_54fc = (uint)(ushort)~(ushort)uVar65;
      pRVar1 = ray + 0x200;
      puVar56 = local_4440;
      local_4450 = 0xfffffffffffffff8;
      pauVar58 = (undefined1 (*) [64])local_3c40;
      local_3cc0 = auVar72;
      local_3c80 = local_4500;
      uStack_3c7c = uStack_44fc;
      uStack_3c78 = uStack_44f8;
      uStack_3c74 = uStack_44f4;
      uStack_3c70 = uStack_44f0;
      uStack_3c6c = uStack_44ec;
      uStack_3c68 = uStack_44e8;
      uStack_3c64 = uStack_44e4;
      uStack_3c60 = uStack_44e0;
      uStack_3c5c = uStack_44dc;
      uStack_3c58 = uStack_44d8;
      uStack_3c54 = uStack_44d4;
      uStack_3c50 = uStack_44d0;
      uStack_3c4c = uStack_44cc;
      uStack_3c48 = uStack_44c8;
      uStack_3c44 = uStack_44c4;
      local_5488 = (undefined1 (*) [32])local_4f00;
      auVar69 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
      auVar73 = ZEXT1664(auVar69);
      auVar71 = vbroadcastss_avx512f(ZEXT416(0x34000000));
      auVar130 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      local_5380 = This;
LAB_01ebae96:
      do {
        do {
          root.ptr = puVar56[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01ebc88f;
          puVar56 = puVar56 + -1;
          pauVar58 = pauVar58 + -1;
          local_5300 = *pauVar58;
          auVar77._4_4_ = uStack_44bc;
          auVar77._0_4_ = local_44c0;
          auVar77._8_4_ = uStack_44b8;
          auVar77._12_4_ = uStack_44b4;
          auVar77._16_4_ = uStack_44b0;
          auVar77._20_4_ = uStack_44ac;
          auVar77._24_4_ = uStack_44a8;
          auVar77._28_4_ = uStack_44a4;
          auVar77._32_4_ = uStack_44a0;
          auVar77._36_4_ = uStack_449c;
          auVar77._40_4_ = uStack_4498;
          auVar77._44_4_ = uStack_4494;
          auVar77._48_4_ = uStack_4490;
          auVar77._52_4_ = uStack_448c;
          auVar77._56_4_ = uStack_4488;
          auVar77._60_4_ = uStack_4484;
          uVar48 = vcmpps_avx512f(local_5300,auVar77,1);
        } while ((short)uVar48 == 0);
        uVar60 = (undefined4)uVar48;
        if (uVar42 < (uint)POPCOUNT(uVar60)) {
LAB_01ebaed9:
          do {
            uVar51 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01ebc88f;
              auVar90._4_4_ = uStack_44bc;
              auVar90._0_4_ = local_44c0;
              auVar90._8_4_ = uStack_44b8;
              auVar90._12_4_ = uStack_44b4;
              auVar90._16_4_ = uStack_44b0;
              auVar90._20_4_ = uStack_44ac;
              auVar90._24_4_ = uStack_44a8;
              auVar90._28_4_ = uStack_44a4;
              auVar90._32_4_ = uStack_44a0;
              auVar90._36_4_ = uStack_449c;
              auVar90._40_4_ = uStack_4498;
              auVar90._44_4_ = uStack_4494;
              auVar90._48_4_ = uStack_4490;
              auVar90._52_4_ = uStack_448c;
              auVar90._56_4_ = uStack_4488;
              auVar90._60_4_ = uStack_4484;
              uVar22 = vcmpps_avx512f(local_5300,auVar90,9);
              if ((short)uVar22 != 0) {
                if ((uVar51 & 0xf) == 8) {
                  auVar69 = vcvtusi2ss_avx512f(in_ZMM11._0_16_,
                                               *(int *)(local_5498.super_Precalculations.grid + 8) +
                                               -1);
                  auVar74 = vbroadcastss_avx512f(auVar69);
                  auVar74 = vmulps_avx512f(auVar74,*(undefined1 (*) [64])(ray + 0x1c0));
                  auVar75 = vrndscaleps_avx512f(auVar74,1);
                  uVar51 = ~local_54fc;
                  auVar76 = vbroadcastss_avx512f(ZEXT416((uint)(auVar69._0_4_ + -1.0)));
                  auVar75 = vminps_avx512f(auVar75,auVar76);
                  auVar75 = vmaxps_avx512f(auVar75,auVar73);
                  local_49c0 = vsubps_avx512f(auVar74,auVar75);
                  local_4e80 = vcvtps2dq_avx512f(auVar75);
                  auVar74 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                  local_4a00 = vsubps_avx512f(auVar74,local_49c0);
                  uVar48 = root.ptr >> 2 & 0xfffffffffffffffc;
                  local_54cc = uVar51;
                  local_5378 = pauVar58;
                  local_5370 = puVar56;
                  for (; (short)uVar51 != 0; uVar51 = uVar51 & uVar47) {
                    uVar47 = 0;
                    for (uVar46 = uVar51; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x80000000) {
                      uVar47 = uVar47 + 1;
                    }
                    auVar74 = vpbroadcastd_avx512f();
                    uVar22 = vpcmpeqd_avx512f(auVar74,local_4e80);
                    uVar46 = (uint)uVar22 & uVar51;
                    uVar66 = CONCAT44(0,*(uint *)(local_5498.super_Precalculations.grid + 0x14));
                    uVar53 = (ulong)*(uint *)(local_5498.super_Precalculations.grid + 0xc);
                    lVar63 = (ulong)*(uint *)(local_5498.super_Precalculations.grid + 0x28) *
                             (long)*(int *)(local_4e80 + (ulong)uVar47 * 4);
                    local_5340._0_8_ = local_5498.super_Precalculations.grid;
                    uVar67 = (ulong)*(uint *)(local_5498.super_Precalculations.grid + 0x24);
                    uVar61 = (ulong)(*(uint *)(local_5498.super_Precalculations.grid + 0x28) &
                                    0xfffffffc);
                    lVar52 = uVar61 + uVar67 + lVar63;
                    lVar59 = uVar66 * 0xc + lVar52;
                    local_54b8 = local_5498.super_Precalculations.grid +
                                 uVar53 * 4 + lVar59 + uVar48;
                    local_51c0._0_8_ = uVar66;
                    lVar54 = lVar63 + uVar66 * 8 + uVar67;
                    lVar62 = uVar61 + lVar54;
                    pGVar49 = local_5498.super_Precalculations.grid + lVar62 + uVar53 * 4 + uVar48;
                    lVar55 = lVar52 + uVar66 * 4;
                    local_5450 = local_5498.super_Precalculations.grid +
                                 lVar55 + uVar53 * 4 + uVar48;
                    local_5458 = local_5498.super_Precalculations.grid +
                                 lVar52 + uVar53 * 4 + uVar48;
                    lVar43 = uVar48 + 0x30;
                    local_5460 = local_5498.super_Precalculations.grid +
                                 uVar67 + lVar63 + uVar53 * 4 + lVar43;
                    local_5468 = local_5498.super_Precalculations.grid +
                                 lVar54 + uVar53 * 4 + lVar43;
                    lVar50 = lVar63 + uVar66 * 4 + uVar67;
                    local_5478 = local_5498.super_Precalculations.grid +
                                 lVar50 + uVar53 * 4 + lVar43;
                    local_54b0 = local_5498.super_Precalculations.grid + lVar59 + lVar43;
                    pGVar57 = local_5498.super_Precalculations.grid + lVar62 + lVar43;
                    local_5448 = local_5498.super_Precalculations.grid + lVar55 + lVar43;
                    local_5438 = local_5498.super_Precalculations.grid + lVar52 + lVar43;
                    local_5440 = local_5498.super_Precalculations.grid + lVar54 + lVar43;
                    local_5470 = local_5498.super_Precalculations.grid + lVar50 + lVar43;
                    pGVar64 = local_5498.super_Precalculations.grid + lVar63;
                    uVar47 = ~uVar46;
                    local_5350 = (ulong)(uVar53 != 2) * 4 + 4;
                    local_5480 = (ulong)(*(int *)(local_5498.super_Precalculations.grid + 0x10) != 2
                                        ) + 1;
                    local_5368 = uVar53 * 4;
                    local_5360 = uVar67 + 0x2c;
                    lVar55 = 0;
                    while (lVar55 != local_5480) {
                      local_5358 = lVar55 + 1;
                      local_5348 = pGVar64 + local_5360 + uVar48;
                      lVar55 = 0;
                      do {
                        auVar74 = _local_5400;
                        auVar69 = auVar73._0_16_;
                        if (local_5350 == lVar55) goto LAB_01ebc675;
                        uVar60 = *(undefined4 *)(local_5438 + lVar55 + -4);
                        auVar91._4_4_ = uVar60;
                        auVar91._0_4_ = uVar60;
                        auVar91._8_4_ = uVar60;
                        auVar91._12_4_ = uVar60;
                        auVar91._16_4_ = uVar60;
                        auVar91._20_4_ = uVar60;
                        auVar91._24_4_ = uVar60;
                        auVar91._28_4_ = uVar60;
                        auVar91._32_4_ = uVar60;
                        auVar91._36_4_ = uVar60;
                        auVar91._40_4_ = uVar60;
                        auVar91._44_4_ = uVar60;
                        auVar91._48_4_ = uVar60;
                        auVar91._52_4_ = uVar60;
                        auVar91._56_4_ = uVar60;
                        auVar91._60_4_ = uVar60;
                        auVar75 = vmulps_avx512f(local_49c0,auVar91);
                        uVar60 = *(undefined4 *)(local_5448 + lVar55 + -4);
                        auVar92._4_4_ = uVar60;
                        auVar92._0_4_ = uVar60;
                        auVar92._8_4_ = uVar60;
                        auVar92._12_4_ = uVar60;
                        auVar92._16_4_ = uVar60;
                        auVar92._20_4_ = uVar60;
                        auVar92._24_4_ = uVar60;
                        auVar92._28_4_ = uVar60;
                        auVar92._32_4_ = uVar60;
                        auVar92._36_4_ = uVar60;
                        auVar92._40_4_ = uVar60;
                        auVar92._44_4_ = uVar60;
                        auVar92._48_4_ = uVar60;
                        auVar92._52_4_ = uVar60;
                        auVar92._56_4_ = uVar60;
                        auVar92._60_4_ = uVar60;
                        auVar76 = vmulps_avx512f(local_49c0,auVar92);
                        uVar60 = *(undefined4 *)(pGVar57 + lVar55 + -4);
                        auVar93._4_4_ = uVar60;
                        auVar93._0_4_ = uVar60;
                        auVar93._8_4_ = uVar60;
                        auVar93._12_4_ = uVar60;
                        auVar93._16_4_ = uVar60;
                        auVar93._20_4_ = uVar60;
                        auVar93._24_4_ = uVar60;
                        auVar93._28_4_ = uVar60;
                        auVar93._32_4_ = uVar60;
                        auVar93._36_4_ = uVar60;
                        auVar93._40_4_ = uVar60;
                        auVar93._44_4_ = uVar60;
                        auVar93._48_4_ = uVar60;
                        auVar93._52_4_ = uVar60;
                        auVar93._56_4_ = uVar60;
                        auVar93._60_4_ = uVar60;
                        auVar77 = vmulps_avx512f(local_49c0,auVar93);
                        uVar60 = *(undefined4 *)(local_5348 + lVar55);
                        auVar94._4_4_ = uVar60;
                        auVar94._0_4_ = uVar60;
                        auVar94._8_4_ = uVar60;
                        auVar94._12_4_ = uVar60;
                        auVar94._16_4_ = uVar60;
                        auVar94._20_4_ = uVar60;
                        auVar94._24_4_ = uVar60;
                        auVar94._28_4_ = uVar60;
                        auVar94._32_4_ = uVar60;
                        auVar94._36_4_ = uVar60;
                        auVar94._40_4_ = uVar60;
                        auVar94._44_4_ = uVar60;
                        auVar94._48_4_ = uVar60;
                        auVar94._52_4_ = uVar60;
                        auVar94._56_4_ = uVar60;
                        auVar94._60_4_ = uVar60;
                        auVar81 = vfmadd231ps_avx512f(auVar75,local_4a00,auVar94);
                        uVar60 = *(undefined4 *)(local_5470 + lVar55 + -4);
                        auVar95._4_4_ = uVar60;
                        auVar95._0_4_ = uVar60;
                        auVar95._8_4_ = uVar60;
                        auVar95._12_4_ = uVar60;
                        auVar95._16_4_ = uVar60;
                        auVar95._20_4_ = uVar60;
                        auVar95._24_4_ = uVar60;
                        auVar95._28_4_ = uVar60;
                        auVar95._32_4_ = uVar60;
                        auVar95._36_4_ = uVar60;
                        auVar95._40_4_ = uVar60;
                        auVar95._44_4_ = uVar60;
                        auVar95._48_4_ = uVar60;
                        auVar95._52_4_ = uVar60;
                        auVar95._56_4_ = uVar60;
                        auVar95._60_4_ = uVar60;
                        auVar82 = vfmadd231ps_avx512f(auVar76,local_4a00,auVar95);
                        uVar60 = *(undefined4 *)(local_5440 + lVar55 + -4);
                        auVar96._4_4_ = uVar60;
                        auVar96._0_4_ = uVar60;
                        auVar96._8_4_ = uVar60;
                        auVar96._12_4_ = uVar60;
                        auVar96._16_4_ = uVar60;
                        auVar96._20_4_ = uVar60;
                        auVar96._24_4_ = uVar60;
                        auVar96._28_4_ = uVar60;
                        auVar96._32_4_ = uVar60;
                        auVar96._36_4_ = uVar60;
                        auVar96._40_4_ = uVar60;
                        auVar96._44_4_ = uVar60;
                        auVar96._48_4_ = uVar60;
                        auVar96._52_4_ = uVar60;
                        auVar96._56_4_ = uVar60;
                        auVar96._60_4_ = uVar60;
                        auVar83 = vfmadd231ps_avx512f(auVar77,local_4a00,auVar96);
                        uVar60 = *(undefined4 *)(local_5438 + lVar55);
                        auVar97._4_4_ = uVar60;
                        auVar97._0_4_ = uVar60;
                        auVar97._8_4_ = uVar60;
                        auVar97._12_4_ = uVar60;
                        auVar97._16_4_ = uVar60;
                        auVar97._20_4_ = uVar60;
                        auVar97._24_4_ = uVar60;
                        auVar97._28_4_ = uVar60;
                        auVar97._32_4_ = uVar60;
                        auVar97._36_4_ = uVar60;
                        auVar97._40_4_ = uVar60;
                        auVar97._44_4_ = uVar60;
                        auVar97._48_4_ = uVar60;
                        auVar97._52_4_ = uVar60;
                        auVar97._56_4_ = uVar60;
                        auVar97._60_4_ = uVar60;
                        auVar75 = vmulps_avx512f(local_49c0,auVar97);
                        uVar60 = *(undefined4 *)(local_5448 + lVar55);
                        auVar98._4_4_ = uVar60;
                        auVar98._0_4_ = uVar60;
                        auVar98._8_4_ = uVar60;
                        auVar98._12_4_ = uVar60;
                        auVar98._16_4_ = uVar60;
                        auVar98._20_4_ = uVar60;
                        auVar98._24_4_ = uVar60;
                        auVar98._28_4_ = uVar60;
                        auVar98._32_4_ = uVar60;
                        auVar98._36_4_ = uVar60;
                        auVar98._40_4_ = uVar60;
                        auVar98._44_4_ = uVar60;
                        auVar98._48_4_ = uVar60;
                        auVar98._52_4_ = uVar60;
                        auVar98._56_4_ = uVar60;
                        auVar98._60_4_ = uVar60;
                        auVar76 = vmulps_avx512f(local_49c0,auVar98);
                        uVar60 = *(undefined4 *)(pGVar57 + lVar55);
                        auVar99._4_4_ = uVar60;
                        auVar99._0_4_ = uVar60;
                        auVar99._8_4_ = uVar60;
                        auVar99._12_4_ = uVar60;
                        auVar99._16_4_ = uVar60;
                        auVar99._20_4_ = uVar60;
                        auVar99._24_4_ = uVar60;
                        auVar99._28_4_ = uVar60;
                        auVar99._32_4_ = uVar60;
                        auVar99._36_4_ = uVar60;
                        auVar99._40_4_ = uVar60;
                        auVar99._44_4_ = uVar60;
                        auVar99._48_4_ = uVar60;
                        auVar99._52_4_ = uVar60;
                        auVar99._56_4_ = uVar60;
                        auVar99._60_4_ = uVar60;
                        auVar77 = vmulps_avx512f(local_49c0,auVar99);
                        uVar60 = *(undefined4 *)(local_5348 + lVar55 + 4);
                        auVar25._4_4_ = uVar60;
                        auVar25._0_4_ = uVar60;
                        auVar25._8_4_ = uVar60;
                        auVar25._12_4_ = uVar60;
                        auVar25._16_4_ = uVar60;
                        auVar25._20_4_ = uVar60;
                        auVar25._24_4_ = uVar60;
                        auVar25._28_4_ = uVar60;
                        auVar25._32_4_ = uVar60;
                        auVar25._36_4_ = uVar60;
                        auVar25._40_4_ = uVar60;
                        auVar25._44_4_ = uVar60;
                        auVar25._48_4_ = uVar60;
                        auVar25._52_4_ = uVar60;
                        auVar25._56_4_ = uVar60;
                        auVar25._60_4_ = uVar60;
                        auVar80 = vfmadd231ps_avx512f(auVar75,local_4a00,auVar25);
                        uVar60 = *(undefined4 *)(local_5470 + lVar55);
                        auVar26._4_4_ = uVar60;
                        auVar26._0_4_ = uVar60;
                        auVar26._8_4_ = uVar60;
                        auVar26._12_4_ = uVar60;
                        auVar26._16_4_ = uVar60;
                        auVar26._20_4_ = uVar60;
                        auVar26._24_4_ = uVar60;
                        auVar26._28_4_ = uVar60;
                        auVar26._32_4_ = uVar60;
                        auVar26._36_4_ = uVar60;
                        auVar26._40_4_ = uVar60;
                        auVar26._44_4_ = uVar60;
                        auVar26._48_4_ = uVar60;
                        auVar26._52_4_ = uVar60;
                        auVar26._56_4_ = uVar60;
                        auVar26._60_4_ = uVar60;
                        local_5340 = vfmadd231ps_avx512f(auVar76,local_4a00,auVar26);
                        uVar60 = *(undefined4 *)(local_5440 + lVar55);
                        auVar27._4_4_ = uVar60;
                        auVar27._0_4_ = uVar60;
                        auVar27._8_4_ = uVar60;
                        auVar27._12_4_ = uVar60;
                        auVar27._16_4_ = uVar60;
                        auVar27._20_4_ = uVar60;
                        auVar27._24_4_ = uVar60;
                        auVar27._28_4_ = uVar60;
                        auVar27._32_4_ = uVar60;
                        auVar27._36_4_ = uVar60;
                        auVar27._40_4_ = uVar60;
                        auVar27._44_4_ = uVar60;
                        auVar27._48_4_ = uVar60;
                        auVar27._52_4_ = uVar60;
                        auVar27._56_4_ = uVar60;
                        auVar27._60_4_ = uVar60;
                        local_5300 = vfmadd231ps_avx512f(auVar77,local_4a00,auVar27);
                        uVar60 = *(undefined4 *)(local_5458 + lVar55 + 0x2c);
                        auVar28._4_4_ = uVar60;
                        auVar28._0_4_ = uVar60;
                        auVar28._8_4_ = uVar60;
                        auVar28._12_4_ = uVar60;
                        auVar28._16_4_ = uVar60;
                        auVar28._20_4_ = uVar60;
                        auVar28._24_4_ = uVar60;
                        auVar28._28_4_ = uVar60;
                        auVar28._32_4_ = uVar60;
                        auVar28._36_4_ = uVar60;
                        auVar28._40_4_ = uVar60;
                        auVar28._44_4_ = uVar60;
                        auVar28._48_4_ = uVar60;
                        auVar28._52_4_ = uVar60;
                        auVar28._56_4_ = uVar60;
                        auVar28._60_4_ = uVar60;
                        auVar75 = vmulps_avx512f(local_49c0,auVar28);
                        uVar60 = *(undefined4 *)(local_5450 + lVar55 + 0x2c);
                        auVar29._4_4_ = uVar60;
                        auVar29._0_4_ = uVar60;
                        auVar29._8_4_ = uVar60;
                        auVar29._12_4_ = uVar60;
                        auVar29._16_4_ = uVar60;
                        auVar29._20_4_ = uVar60;
                        auVar29._24_4_ = uVar60;
                        auVar29._28_4_ = uVar60;
                        auVar29._32_4_ = uVar60;
                        auVar29._36_4_ = uVar60;
                        auVar29._40_4_ = uVar60;
                        auVar29._44_4_ = uVar60;
                        auVar29._48_4_ = uVar60;
                        auVar29._52_4_ = uVar60;
                        auVar29._56_4_ = uVar60;
                        auVar29._60_4_ = uVar60;
                        auVar76 = vmulps_avx512f(local_49c0,auVar29);
                        uVar60 = *(undefined4 *)(pGVar49 + lVar55 + 0x2c);
                        auVar30._4_4_ = uVar60;
                        auVar30._0_4_ = uVar60;
                        auVar30._8_4_ = uVar60;
                        auVar30._12_4_ = uVar60;
                        auVar30._16_4_ = uVar60;
                        auVar30._20_4_ = uVar60;
                        auVar30._24_4_ = uVar60;
                        auVar30._28_4_ = uVar60;
                        auVar30._32_4_ = uVar60;
                        auVar30._36_4_ = uVar60;
                        auVar30._40_4_ = uVar60;
                        auVar30._44_4_ = uVar60;
                        auVar30._48_4_ = uVar60;
                        auVar30._52_4_ = uVar60;
                        auVar30._56_4_ = uVar60;
                        auVar30._60_4_ = uVar60;
                        auVar77 = vmulps_avx512f(local_49c0,auVar30);
                        uVar60 = *(undefined4 *)(local_5460 + lVar55 + -4);
                        auVar31._4_4_ = uVar60;
                        auVar31._0_4_ = uVar60;
                        auVar31._8_4_ = uVar60;
                        auVar31._12_4_ = uVar60;
                        auVar31._16_4_ = uVar60;
                        auVar31._20_4_ = uVar60;
                        auVar31._24_4_ = uVar60;
                        auVar31._28_4_ = uVar60;
                        auVar31._32_4_ = uVar60;
                        auVar31._36_4_ = uVar60;
                        auVar31._40_4_ = uVar60;
                        auVar31._44_4_ = uVar60;
                        auVar31._48_4_ = uVar60;
                        auVar31._52_4_ = uVar60;
                        auVar31._56_4_ = uVar60;
                        auVar31._60_4_ = uVar60;
                        local_51c0 = vfmadd231ps_avx512f(auVar75,local_4a00,auVar31);
                        uVar60 = *(undefined4 *)(local_5478 + lVar55 + -4);
                        auVar32._4_4_ = uVar60;
                        auVar32._0_4_ = uVar60;
                        auVar32._8_4_ = uVar60;
                        auVar32._12_4_ = uVar60;
                        auVar32._16_4_ = uVar60;
                        auVar32._20_4_ = uVar60;
                        auVar32._24_4_ = uVar60;
                        auVar32._28_4_ = uVar60;
                        auVar32._32_4_ = uVar60;
                        auVar32._36_4_ = uVar60;
                        auVar32._40_4_ = uVar60;
                        auVar32._44_4_ = uVar60;
                        auVar32._48_4_ = uVar60;
                        auVar32._52_4_ = uVar60;
                        auVar32._56_4_ = uVar60;
                        auVar32._60_4_ = uVar60;
                        local_4900 = vfmadd231ps_avx512f(auVar76,local_4a00,auVar32);
                        uVar60 = *(undefined4 *)(local_5468 + lVar55 + -4);
                        auVar33._4_4_ = uVar60;
                        auVar33._0_4_ = uVar60;
                        auVar33._8_4_ = uVar60;
                        auVar33._12_4_ = uVar60;
                        auVar33._16_4_ = uVar60;
                        auVar33._20_4_ = uVar60;
                        auVar33._24_4_ = uVar60;
                        auVar33._28_4_ = uVar60;
                        auVar33._32_4_ = uVar60;
                        auVar33._36_4_ = uVar60;
                        auVar33._40_4_ = uVar60;
                        auVar33._44_4_ = uVar60;
                        auVar33._48_4_ = uVar60;
                        auVar33._52_4_ = uVar60;
                        auVar33._56_4_ = uVar60;
                        auVar33._60_4_ = uVar60;
                        local_4940 = vfmadd231ps_avx512f(auVar77,local_4a00,auVar33);
                        auVar75 = *(undefined1 (*) [64])ray;
                        auVar76 = *(undefined1 (*) [64])(ray + 0x40);
                        auVar77 = *(undefined1 (*) [64])(ray + 0x80);
                        auVar103 = *(undefined1 (*) [64])(ray + 0x100);
                        auVar78 = *(undefined1 (*) [64])(ray + 0x140);
                        auVar79 = *(undefined1 (*) [64])(ray + 0x180);
                        auVar81 = vsubps_avx512f(auVar81,auVar75);
                        auVar82 = vsubps_avx512f(auVar82,auVar76);
                        auVar83 = vsubps_avx512f(auVar83,auVar77);
                        auVar84 = vsubps_avx512f(auVar80,auVar75);
                        auVar85 = vsubps_avx512f(local_5340,auVar76);
                        auVar86 = vsubps_avx512f(local_5300,auVar77);
                        auVar75 = vsubps_avx512f(local_51c0,auVar75);
                        auVar76 = vsubps_avx512f(local_4900,auVar76);
                        auVar77 = vsubps_avx512f(local_4940,auVar77);
                        auVar87 = vsubps_avx512f(auVar75,auVar81);
                        auVar88 = vsubps_avx512f(auVar76,auVar82);
                        auVar89 = vsubps_avx512f(auVar77,auVar83);
                        auVar90 = vsubps_avx512f(auVar81,auVar84);
                        auVar91 = vsubps_avx512f(auVar82,auVar85);
                        auVar92 = vsubps_avx512f(auVar83,auVar86);
                        auVar93 = vaddps_avx512f(auVar75,auVar81);
                        auVar94 = vaddps_avx512f(auVar76,auVar82);
                        auVar95 = vaddps_avx512f(auVar77,auVar83);
                        auVar96 = vmulps_avx512f(auVar94,auVar89);
                        auVar96 = vfmsub231ps_avx512f(auVar96,auVar88,auVar95);
                        auVar95 = vmulps_avx512f(auVar95,auVar87);
                        auVar95 = vfmsub231ps_avx512f(auVar95,auVar89,auVar93);
                        auVar93 = vmulps_avx512f(auVar93,auVar88);
                        auVar93 = vfmsub231ps_avx512f(auVar93,auVar87,auVar94);
                        auVar93 = vmulps_avx512f(auVar93,auVar79);
                        auVar93 = vfmadd231ps_avx512f(auVar93,auVar78,auVar95);
                        auVar93 = vfmadd231ps_avx512f(auVar93,auVar103,auVar96);
                        auVar94 = vaddps_avx512f(auVar81,auVar84);
                        auVar95 = vaddps_avx512f(auVar82,auVar85);
                        auVar96 = vaddps_avx512f(auVar83,auVar86);
                        auVar97 = vmulps_avx512f(auVar95,auVar92);
                        auVar97 = vfmsub231ps_avx512f(auVar97,auVar91,auVar96);
                        auVar96 = vmulps_avx512f(auVar96,auVar90);
                        auVar96 = vfmsub231ps_avx512f(auVar96,auVar92,auVar94);
                        auVar94 = vmulps_avx512f(auVar94,auVar91);
                        auVar94 = vfmsub231ps_avx512f(auVar94,auVar90,auVar95);
                        uVar60 = *(undefined4 *)(local_5458 + lVar55 + 0x30);
                        auVar34._4_4_ = uVar60;
                        auVar34._0_4_ = uVar60;
                        auVar34._8_4_ = uVar60;
                        auVar34._12_4_ = uVar60;
                        auVar34._16_4_ = uVar60;
                        auVar34._20_4_ = uVar60;
                        auVar34._24_4_ = uVar60;
                        auVar34._28_4_ = uVar60;
                        auVar34._32_4_ = uVar60;
                        auVar34._36_4_ = uVar60;
                        auVar34._40_4_ = uVar60;
                        auVar34._44_4_ = uVar60;
                        auVar34._48_4_ = uVar60;
                        auVar34._52_4_ = uVar60;
                        auVar34._56_4_ = uVar60;
                        auVar34._60_4_ = uVar60;
                        auVar95 = vmulps_avx512f(local_49c0,auVar34);
                        auVar94 = vmulps_avx512f(auVar94,auVar79);
                        auVar94 = vfmadd231ps_avx512f(auVar94,auVar78,auVar96);
                        auVar96 = vsubps_avx512f(auVar84,auVar75);
                        in_ZMM11 = vfmadd231ps_avx512f(auVar94,auVar103,auVar97);
                        auVar94 = vsubps_avx512f(auVar85,auVar76);
                        auVar75 = vaddps_avx512f(auVar84,auVar75);
                        auVar84 = vsubps_avx512f(auVar86,auVar77);
                        auVar76 = vaddps_avx512f(auVar85,auVar76);
                        auVar77 = vaddps_avx512f(auVar86,auVar77);
                        auVar85 = vmulps_avx512f(auVar76,auVar84);
                        auVar85 = vfmsub231ps_avx512f(auVar85,auVar94,auVar77);
                        auVar77 = vmulps_avx512f(auVar77,auVar96);
                        auVar77 = vfmsub231ps_avx512f(auVar77,auVar84,auVar75);
                        auVar75 = vmulps_avx512f(auVar75,auVar94);
                        auVar75 = vfmsub231ps_avx512f(auVar75,auVar96,auVar76);
                        auVar75 = vmulps_avx512f(auVar75,auVar79);
                        auVar75 = vfmadd231ps_avx512f(auVar75,auVar78,auVar77);
                        auVar75 = vfmadd231ps_avx512f(auVar75,auVar103,auVar85);
                        auVar76 = vaddps_avx512f(auVar93,in_ZMM11);
                        auVar77 = vaddps_avx512f(auVar75,auVar76);
                        auVar76 = vandps_avx512dq(auVar77,auVar70);
                        auVar85 = vmulps_avx512f(auVar76,auVar71);
                        auVar76 = vminps_avx512f(auVar93,in_ZMM11);
                        auVar76 = vminps_avx512f(auVar76,auVar75);
                        auVar86 = vxorps_avx512dq(auVar85,auVar130);
                        uVar22 = vcmpps_avx512f(auVar76,auVar86,5);
                        uVar60 = *(undefined4 *)(local_5450 + lVar55 + 0x30);
                        auVar35._4_4_ = uVar60;
                        auVar35._0_4_ = uVar60;
                        auVar35._8_4_ = uVar60;
                        auVar35._12_4_ = uVar60;
                        auVar35._16_4_ = uVar60;
                        auVar35._20_4_ = uVar60;
                        auVar35._24_4_ = uVar60;
                        auVar35._28_4_ = uVar60;
                        auVar35._32_4_ = uVar60;
                        auVar35._36_4_ = uVar60;
                        auVar35._40_4_ = uVar60;
                        auVar35._44_4_ = uVar60;
                        auVar35._48_4_ = uVar60;
                        auVar35._52_4_ = uVar60;
                        auVar35._56_4_ = uVar60;
                        auVar35._60_4_ = uVar60;
                        auVar76 = vmulps_avx512f(local_49c0,auVar35);
                        auVar86 = vmaxps_avx512f(auVar93,in_ZMM11);
                        auVar75 = vmaxps_avx512f(auVar86,auVar75);
                        uVar60 = *(undefined4 *)(pGVar49 + lVar55 + 0x30);
                        auVar36._4_4_ = uVar60;
                        auVar36._0_4_ = uVar60;
                        auVar36._8_4_ = uVar60;
                        auVar36._12_4_ = uVar60;
                        auVar36._16_4_ = uVar60;
                        auVar36._20_4_ = uVar60;
                        auVar36._24_4_ = uVar60;
                        auVar36._28_4_ = uVar60;
                        auVar36._32_4_ = uVar60;
                        auVar36._36_4_ = uVar60;
                        auVar36._40_4_ = uVar60;
                        auVar36._44_4_ = uVar60;
                        auVar36._48_4_ = uVar60;
                        auVar36._52_4_ = uVar60;
                        auVar36._56_4_ = uVar60;
                        auVar36._60_4_ = uVar60;
                        auVar86 = vmulps_avx512f(local_49c0,auVar36);
                        uVar60 = *(undefined4 *)(local_5460 + lVar55);
                        auVar37._4_4_ = uVar60;
                        auVar37._0_4_ = uVar60;
                        auVar37._8_4_ = uVar60;
                        auVar37._12_4_ = uVar60;
                        auVar37._16_4_ = uVar60;
                        auVar37._20_4_ = uVar60;
                        auVar37._24_4_ = uVar60;
                        auVar37._28_4_ = uVar60;
                        auVar37._32_4_ = uVar60;
                        auVar37._36_4_ = uVar60;
                        auVar37._40_4_ = uVar60;
                        auVar37._44_4_ = uVar60;
                        auVar37._48_4_ = uVar60;
                        auVar37._52_4_ = uVar60;
                        auVar37._56_4_ = uVar60;
                        auVar37._60_4_ = uVar60;
                        local_4980 = vfmadd231ps_avx512f(auVar95,local_4a00,auVar37);
                        uVar60 = *(undefined4 *)(local_5478 + lVar55);
                        auVar38._4_4_ = uVar60;
                        auVar38._0_4_ = uVar60;
                        auVar38._8_4_ = uVar60;
                        auVar38._12_4_ = uVar60;
                        auVar38._16_4_ = uVar60;
                        auVar38._20_4_ = uVar60;
                        auVar38._24_4_ = uVar60;
                        auVar38._28_4_ = uVar60;
                        auVar38._32_4_ = uVar60;
                        auVar38._36_4_ = uVar60;
                        auVar38._40_4_ = uVar60;
                        auVar38._44_4_ = uVar60;
                        auVar38._48_4_ = uVar60;
                        auVar38._52_4_ = uVar60;
                        auVar38._56_4_ = uVar60;
                        auVar38._60_4_ = uVar60;
                        auVar76 = vfmadd231ps_avx512f(auVar76,local_4a00,auVar38);
                        uVar23 = vcmpps_avx512f(auVar75,auVar85,2);
                        uVar60 = *(undefined4 *)(local_5468 + lVar55);
                        auVar39._4_4_ = uVar60;
                        auVar39._0_4_ = uVar60;
                        auVar39._8_4_ = uVar60;
                        auVar39._12_4_ = uVar60;
                        auVar39._16_4_ = uVar60;
                        auVar39._20_4_ = uVar60;
                        auVar39._24_4_ = uVar60;
                        auVar39._28_4_ = uVar60;
                        auVar39._32_4_ = uVar60;
                        auVar39._36_4_ = uVar60;
                        auVar39._40_4_ = uVar60;
                        auVar39._44_4_ = uVar60;
                        auVar39._48_4_ = uVar60;
                        auVar39._52_4_ = uVar60;
                        auVar39._56_4_ = uVar60;
                        auVar39._60_4_ = uVar60;
                        auVar75 = vfmadd231ps_avx512f(auVar86,local_4a00,auVar39);
                        uVar45 = ((ushort)uVar22 | (ushort)uVar23) & (ushort)uVar46;
                        if (uVar45 == 0) {
LAB_01ebbc07:
                          uVar45 = 0;
                        }
                        else {
                          auVar85 = vmulps_avx512f(auVar91,auVar89);
                          auVar86 = vmulps_avx512f(auVar87,auVar92);
                          auVar95 = vmulps_avx512f(auVar90,auVar88);
                          auVar97 = vmulps_avx512f(auVar94,auVar92);
                          auVar98 = vmulps_avx512f(auVar90,auVar84);
                          auVar99 = vmulps_avx512f(auVar96,auVar91);
                          auVar88 = vfmsub213ps_avx512f(auVar88,auVar92,auVar85);
                          auVar89 = vfmsub213ps_avx512f(auVar89,auVar90,auVar86);
                          auVar87 = vfmsub213ps_avx512f(auVar87,auVar91,auVar95);
                          auVar84 = vfmsub213ps_avx512f(auVar84,auVar91,auVar97);
                          auVar91 = vfmsub213ps_avx512f(auVar96,auVar92,auVar98);
                          auVar90 = vfmsub213ps_avx512f(auVar94,auVar90,auVar99);
                          auVar85 = vandps_avx512dq(auVar85,auVar70);
                          auVar92 = vandps_avx512dq(auVar97,auVar70);
                          uVar67 = vcmpps_avx512f(auVar85,auVar92,1);
                          auVar85 = vandps_avx512dq(auVar86,auVar70);
                          auVar86 = vandps_avx512dq(auVar98,auVar70);
                          uVar66 = vcmpps_avx512f(auVar85,auVar86,1);
                          auVar85 = vandps_avx512dq(auVar95,auVar70);
                          auVar86 = vandps_avx512dq(auVar99,auVar70);
                          uVar53 = vcmpps_avx512f(auVar85,auVar86,1);
                          bVar44 = (bool)((byte)uVar67 & 1);
                          auVar100._0_4_ =
                               (uint)bVar44 * auVar88._0_4_ | (uint)!bVar44 * auVar84._0_4_;
                          bVar44 = (bool)((byte)(uVar67 >> 1) & 1);
                          auVar100._4_4_ =
                               (uint)bVar44 * auVar88._4_4_ | (uint)!bVar44 * auVar84._4_4_;
                          bVar44 = (bool)((byte)(uVar67 >> 2) & 1);
                          auVar100._8_4_ =
                               (uint)bVar44 * auVar88._8_4_ | (uint)!bVar44 * auVar84._8_4_;
                          bVar44 = (bool)((byte)(uVar67 >> 3) & 1);
                          auVar100._12_4_ =
                               (uint)bVar44 * auVar88._12_4_ | (uint)!bVar44 * auVar84._12_4_;
                          bVar44 = (bool)((byte)(uVar67 >> 4) & 1);
                          auVar100._16_4_ =
                               (uint)bVar44 * auVar88._16_4_ | (uint)!bVar44 * auVar84._16_4_;
                          bVar44 = (bool)((byte)(uVar67 >> 5) & 1);
                          auVar100._20_4_ =
                               (uint)bVar44 * auVar88._20_4_ | (uint)!bVar44 * auVar84._20_4_;
                          bVar44 = (bool)((byte)(uVar67 >> 6) & 1);
                          auVar100._24_4_ =
                               (uint)bVar44 * auVar88._24_4_ | (uint)!bVar44 * auVar84._24_4_;
                          bVar44 = (bool)((byte)(uVar67 >> 7) & 1);
                          auVar100._28_4_ =
                               (uint)bVar44 * auVar88._28_4_ | (uint)!bVar44 * auVar84._28_4_;
                          bVar44 = (bool)((byte)(uVar67 >> 8) & 1);
                          auVar100._32_4_ =
                               (uint)bVar44 * auVar88._32_4_ | (uint)!bVar44 * auVar84._32_4_;
                          bVar44 = (bool)((byte)(uVar67 >> 9) & 1);
                          auVar100._36_4_ =
                               (uint)bVar44 * auVar88._36_4_ | (uint)!bVar44 * auVar84._36_4_;
                          bVar44 = (bool)((byte)(uVar67 >> 10) & 1);
                          auVar100._40_4_ =
                               (uint)bVar44 * auVar88._40_4_ | (uint)!bVar44 * auVar84._40_4_;
                          bVar44 = (bool)((byte)(uVar67 >> 0xb) & 1);
                          auVar100._44_4_ =
                               (uint)bVar44 * auVar88._44_4_ | (uint)!bVar44 * auVar84._44_4_;
                          bVar44 = (bool)((byte)(uVar67 >> 0xc) & 1);
                          auVar100._48_4_ =
                               (uint)bVar44 * auVar88._48_4_ | (uint)!bVar44 * auVar84._48_4_;
                          bVar44 = (bool)((byte)(uVar67 >> 0xd) & 1);
                          auVar100._52_4_ =
                               (uint)bVar44 * auVar88._52_4_ | (uint)!bVar44 * auVar84._52_4_;
                          bVar44 = (bool)((byte)(uVar67 >> 0xe) & 1);
                          auVar100._56_4_ =
                               (uint)bVar44 * auVar88._56_4_ | (uint)!bVar44 * auVar84._56_4_;
                          bVar44 = SUB81(uVar67 >> 0xf,0);
                          auVar100._60_4_ =
                               (uint)bVar44 * auVar88._60_4_ | (uint)!bVar44 * auVar84._60_4_;
                          bVar44 = (bool)((byte)uVar66 & 1);
                          auVar101._0_4_ =
                               (uint)bVar44 * auVar89._0_4_ | (uint)!bVar44 * auVar91._0_4_;
                          bVar44 = (bool)((byte)(uVar66 >> 1) & 1);
                          auVar101._4_4_ =
                               (uint)bVar44 * auVar89._4_4_ | (uint)!bVar44 * auVar91._4_4_;
                          bVar44 = (bool)((byte)(uVar66 >> 2) & 1);
                          auVar101._8_4_ =
                               (uint)bVar44 * auVar89._8_4_ | (uint)!bVar44 * auVar91._8_4_;
                          bVar44 = (bool)((byte)(uVar66 >> 3) & 1);
                          auVar101._12_4_ =
                               (uint)bVar44 * auVar89._12_4_ | (uint)!bVar44 * auVar91._12_4_;
                          bVar44 = (bool)((byte)(uVar66 >> 4) & 1);
                          auVar101._16_4_ =
                               (uint)bVar44 * auVar89._16_4_ | (uint)!bVar44 * auVar91._16_4_;
                          bVar44 = (bool)((byte)(uVar66 >> 5) & 1);
                          auVar101._20_4_ =
                               (uint)bVar44 * auVar89._20_4_ | (uint)!bVar44 * auVar91._20_4_;
                          bVar44 = (bool)((byte)(uVar66 >> 6) & 1);
                          auVar101._24_4_ =
                               (uint)bVar44 * auVar89._24_4_ | (uint)!bVar44 * auVar91._24_4_;
                          bVar44 = (bool)((byte)(uVar66 >> 7) & 1);
                          auVar101._28_4_ =
                               (uint)bVar44 * auVar89._28_4_ | (uint)!bVar44 * auVar91._28_4_;
                          bVar44 = (bool)((byte)(uVar66 >> 8) & 1);
                          auVar101._32_4_ =
                               (uint)bVar44 * auVar89._32_4_ | (uint)!bVar44 * auVar91._32_4_;
                          bVar44 = (bool)((byte)(uVar66 >> 9) & 1);
                          auVar101._36_4_ =
                               (uint)bVar44 * auVar89._36_4_ | (uint)!bVar44 * auVar91._36_4_;
                          bVar44 = (bool)((byte)(uVar66 >> 10) & 1);
                          auVar101._40_4_ =
                               (uint)bVar44 * auVar89._40_4_ | (uint)!bVar44 * auVar91._40_4_;
                          bVar44 = (bool)((byte)(uVar66 >> 0xb) & 1);
                          auVar101._44_4_ =
                               (uint)bVar44 * auVar89._44_4_ | (uint)!bVar44 * auVar91._44_4_;
                          bVar44 = (bool)((byte)(uVar66 >> 0xc) & 1);
                          auVar101._48_4_ =
                               (uint)bVar44 * auVar89._48_4_ | (uint)!bVar44 * auVar91._48_4_;
                          bVar44 = (bool)((byte)(uVar66 >> 0xd) & 1);
                          auVar101._52_4_ =
                               (uint)bVar44 * auVar89._52_4_ | (uint)!bVar44 * auVar91._52_4_;
                          bVar44 = (bool)((byte)(uVar66 >> 0xe) & 1);
                          auVar101._56_4_ =
                               (uint)bVar44 * auVar89._56_4_ | (uint)!bVar44 * auVar91._56_4_;
                          bVar44 = SUB81(uVar66 >> 0xf,0);
                          auVar101._60_4_ =
                               (uint)bVar44 * auVar89._60_4_ | (uint)!bVar44 * auVar91._60_4_;
                          bVar44 = (bool)((byte)uVar53 & 1);
                          auVar102._0_4_ =
                               (uint)bVar44 * auVar87._0_4_ | (uint)!bVar44 * auVar90._0_4_;
                          bVar44 = (bool)((byte)(uVar53 >> 1) & 1);
                          auVar102._4_4_ =
                               (uint)bVar44 * auVar87._4_4_ | (uint)!bVar44 * auVar90._4_4_;
                          bVar44 = (bool)((byte)(uVar53 >> 2) & 1);
                          auVar102._8_4_ =
                               (uint)bVar44 * auVar87._8_4_ | (uint)!bVar44 * auVar90._8_4_;
                          bVar44 = (bool)((byte)(uVar53 >> 3) & 1);
                          auVar102._12_4_ =
                               (uint)bVar44 * auVar87._12_4_ | (uint)!bVar44 * auVar90._12_4_;
                          bVar44 = (bool)((byte)(uVar53 >> 4) & 1);
                          auVar102._16_4_ =
                               (uint)bVar44 * auVar87._16_4_ | (uint)!bVar44 * auVar90._16_4_;
                          bVar44 = (bool)((byte)(uVar53 >> 5) & 1);
                          auVar102._20_4_ =
                               (uint)bVar44 * auVar87._20_4_ | (uint)!bVar44 * auVar90._20_4_;
                          bVar44 = (bool)((byte)(uVar53 >> 6) & 1);
                          auVar102._24_4_ =
                               (uint)bVar44 * auVar87._24_4_ | (uint)!bVar44 * auVar90._24_4_;
                          bVar44 = (bool)((byte)(uVar53 >> 7) & 1);
                          auVar102._28_4_ =
                               (uint)bVar44 * auVar87._28_4_ | (uint)!bVar44 * auVar90._28_4_;
                          bVar44 = (bool)((byte)(uVar53 >> 8) & 1);
                          auVar102._32_4_ =
                               (uint)bVar44 * auVar87._32_4_ | (uint)!bVar44 * auVar90._32_4_;
                          bVar44 = (bool)((byte)(uVar53 >> 9) & 1);
                          auVar102._36_4_ =
                               (uint)bVar44 * auVar87._36_4_ | (uint)!bVar44 * auVar90._36_4_;
                          bVar44 = (bool)((byte)(uVar53 >> 10) & 1);
                          auVar102._40_4_ =
                               (uint)bVar44 * auVar87._40_4_ | (uint)!bVar44 * auVar90._40_4_;
                          bVar44 = (bool)((byte)(uVar53 >> 0xb) & 1);
                          auVar102._44_4_ =
                               (uint)bVar44 * auVar87._44_4_ | (uint)!bVar44 * auVar90._44_4_;
                          bVar44 = (bool)((byte)(uVar53 >> 0xc) & 1);
                          auVar102._48_4_ =
                               (uint)bVar44 * auVar87._48_4_ | (uint)!bVar44 * auVar90._48_4_;
                          bVar44 = (bool)((byte)(uVar53 >> 0xd) & 1);
                          auVar102._52_4_ =
                               (uint)bVar44 * auVar87._52_4_ | (uint)!bVar44 * auVar90._52_4_;
                          bVar44 = (bool)((byte)(uVar53 >> 0xe) & 1);
                          auVar102._56_4_ =
                               (uint)bVar44 * auVar87._56_4_ | (uint)!bVar44 * auVar90._56_4_;
                          bVar44 = SUB81(uVar53 >> 0xf,0);
                          auVar102._60_4_ =
                               (uint)bVar44 * auVar87._60_4_ | (uint)!bVar44 * auVar90._60_4_;
                          auVar79 = vmulps_avx512f(auVar79,auVar102);
                          auVar78 = vfmadd213ps_avx512f(auVar78,auVar101,auVar79);
                          auVar103 = vfmadd213ps_avx512f(auVar103,auVar100,auVar78);
                          auVar103 = vaddps_avx512f(auVar103,auVar103);
                          auVar78 = vmulps_avx512f(auVar83,auVar102);
                          auVar78 = vfmadd213ps_avx512f(auVar82,auVar101,auVar78);
                          auVar78 = vfmadd213ps_avx512f(auVar81,auVar100,auVar78);
                          auVar79 = vrcp14ps_avx512f(auVar103);
                          auVar78 = vaddps_avx512f(auVar78,auVar78);
                          auVar40._8_4_ = 0x3f800000;
                          auVar40._0_8_ = 0x3f8000003f800000;
                          auVar40._12_4_ = 0x3f800000;
                          auVar40._16_4_ = 0x3f800000;
                          auVar40._20_4_ = 0x3f800000;
                          auVar40._24_4_ = 0x3f800000;
                          auVar40._28_4_ = 0x3f800000;
                          auVar40._32_4_ = 0x3f800000;
                          auVar40._36_4_ = 0x3f800000;
                          auVar40._40_4_ = 0x3f800000;
                          auVar40._44_4_ = 0x3f800000;
                          auVar40._48_4_ = 0x3f800000;
                          auVar40._52_4_ = 0x3f800000;
                          auVar40._56_4_ = 0x3f800000;
                          auVar40._60_4_ = 0x3f800000;
                          auVar81 = vfnmadd213ps_avx512f(auVar79,auVar103,auVar40);
                          auVar79 = vfmadd132ps_avx512f(auVar81,auVar79,auVar79);
                          auVar78 = vmulps_avx512f(auVar78,auVar79);
                          uVar22 = vcmpps_avx512f(auVar78,*(undefined1 (*) [64])(ray + 0x200),2);
                          uVar23 = vcmpps_avx512f(auVar78,*(undefined1 (*) [64])(ray + 0xc0),0xd);
                          uVar24 = vcmpps_avx512f(auVar103,auVar73,4);
                          uVar45 = uVar45 & (ushort)uVar22 & (ushort)uVar23 & (ushort)uVar24;
                          if (uVar45 == 0) goto LAB_01ebbc07;
                          local_4a40 = auVar93;
                          local_4a80 = in_ZMM11;
                          local_4ac0 = auVar77;
                          local_4b00 = auVar78;
                          local_4b40 = auVar100;
                          local_4b80 = auVar101;
                          local_4bc0 = auVar102;
                        }
                        pGVar2 = (context->scene->geometries).items
                                 [*(uint *)(local_5498.super_Precalculations.grid + 0x18)].ptr;
                        auVar77 = vpbroadcastd_avx512f(ZEXT416(pGVar2->mask));
                        uVar22 = vptestmd_avx512f(auVar77,*(undefined1 (*) [64])(ray + 0x240));
                        uVar45 = (ushort)uVar22 & uVar45;
                        if (uVar45 != 0) {
                          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                             (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            auVar130 = vandps_avx512dq(local_4ac0,auVar70);
                            auVar70._8_4_ = 0x219392ef;
                            auVar70._0_8_ = 0x219392ef219392ef;
                            auVar70._12_4_ = 0x219392ef;
                            auVar70._16_4_ = 0x219392ef;
                            auVar70._20_4_ = 0x219392ef;
                            auVar70._24_4_ = 0x219392ef;
                            auVar70._28_4_ = 0x219392ef;
                            auVar70._32_4_ = 0x219392ef;
                            auVar70._36_4_ = 0x219392ef;
                            auVar70._40_4_ = 0x219392ef;
                            auVar70._44_4_ = 0x219392ef;
                            auVar70._48_4_ = 0x219392ef;
                            auVar70._52_4_ = 0x219392ef;
                            auVar70._56_4_ = 0x219392ef;
                            auVar70._60_4_ = 0x219392ef;
                            uVar67 = vcmpps_avx512f(auVar130,auVar70,5);
                            auVar70 = vrcp14ps_avx512f(local_4ac0);
                            auVar130 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                            auVar71 = vfnmadd213ps_avx512f(auVar70,local_4ac0,auVar130);
                            auVar70 = vfmadd132ps_avx512f(auVar71,auVar70,auVar70);
                            auVar107._4_4_ = (uint)((byte)(uVar67 >> 1) & 1) * auVar70._4_4_;
                            auVar107._0_4_ = (uint)((byte)uVar67 & 1) * auVar70._0_4_;
                            auVar107._8_4_ = (uint)((byte)(uVar67 >> 2) & 1) * auVar70._8_4_;
                            auVar107._12_4_ = (uint)((byte)(uVar67 >> 3) & 1) * auVar70._12_4_;
                            auVar107._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * auVar70._16_4_;
                            auVar107._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * auVar70._20_4_;
                            auVar107._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * auVar70._24_4_;
                            auVar107._28_4_ = (uint)((byte)(uVar67 >> 7) & 1) * auVar70._28_4_;
                            auVar107._32_4_ = (uint)((byte)(uVar67 >> 8) & 1) * auVar70._32_4_;
                            auVar107._36_4_ = (uint)((byte)(uVar67 >> 9) & 1) * auVar70._36_4_;
                            auVar107._40_4_ = (uint)((byte)(uVar67 >> 10) & 1) * auVar70._40_4_;
                            auVar107._44_4_ = (uint)((byte)(uVar67 >> 0xb) & 1) * auVar70._44_4_;
                            auVar107._48_4_ = (uint)((byte)(uVar67 >> 0xc) & 1) * auVar70._48_4_;
                            auVar107._52_4_ = (uint)((byte)(uVar67 >> 0xd) & 1) * auVar70._52_4_;
                            auVar107._56_4_ = (uint)((byte)(uVar67 >> 0xe) & 1) * auVar70._56_4_;
                            auVar107._60_4_ = (uint)(byte)(uVar67 >> 0xf) * auVar70._60_4_;
                            auVar70 = vmulps_avx512f(auVar107,local_4a40);
                            auVar70 = vminps_avx512f(auVar70,auVar130);
                            auVar71 = vmulps_avx512f(auVar107,local_4a80);
                            auVar71 = vminps_avx512f(auVar71,auVar130);
                            local_52c0._0_4_ =
                                 *(undefined4 *)(local_5498.super_Precalculations.grid + 0x1c);
                            auVar72 = vpbroadcastd_avx512f
                                                (ZEXT416(*(uint *)(local_54b0 + lVar55 + -4)));
                            auVar77 = vpsrld_avx512f(auVar72,0x10);
                            auVar103 = vmovdqu16_avx512bw(auVar73);
                            auVar108._2_2_ = auVar103._2_2_;
                            auVar108._0_2_ = auVar72._0_2_;
                            auVar108._4_2_ = auVar72._4_2_;
                            auVar108._6_2_ = auVar103._6_2_;
                            auVar108._8_2_ = auVar72._8_2_;
                            auVar108._10_2_ = auVar103._10_2_;
                            auVar108._12_2_ = auVar72._12_2_;
                            auVar108._14_2_ = auVar103._14_2_;
                            auVar108._16_2_ = auVar72._16_2_;
                            auVar108._18_2_ = auVar103._18_2_;
                            auVar108._20_2_ = auVar72._20_2_;
                            auVar108._22_2_ = auVar103._22_2_;
                            auVar108._24_2_ = auVar72._24_2_;
                            auVar108._26_2_ = auVar103._26_2_;
                            auVar108._28_2_ = auVar72._28_2_;
                            auVar108._30_2_ = auVar103._30_2_;
                            auVar108._32_2_ = auVar72._32_2_;
                            auVar108._34_2_ = auVar103._34_2_;
                            auVar108._36_2_ = auVar72._36_2_;
                            auVar108._38_2_ = auVar103._38_2_;
                            auVar108._40_2_ = auVar72._40_2_;
                            auVar108._42_2_ = auVar103._42_2_;
                            auVar108._44_2_ = auVar72._44_2_;
                            auVar108._46_2_ = auVar103._46_2_;
                            auVar108._48_2_ = auVar72._48_2_;
                            auVar108._50_2_ = auVar103._50_2_;
                            auVar108._52_2_ = auVar72._52_2_;
                            auVar108._54_2_ = auVar103._54_2_;
                            auVar108._56_2_ = auVar72._56_2_;
                            auVar108._58_2_ = auVar103._58_2_;
                            auVar108._62_2_ = auVar103._62_2_;
                            auVar108._60_2_ = auVar72._60_2_;
                            auVar72 = vcvtdq2ps_avx512f(auVar108);
                            auVar103 = vbroadcastss_avx512f(ZEXT416(0x39000000));
                            auVar72 = vmulps_avx512f(auVar72,auVar103);
                            auVar77 = vcvtdq2ps_avx512f(auVar77);
                            auVar77 = vmulps_avx512f(auVar77,auVar103);
                            auVar78 = vpbroadcastd_avx512f(ZEXT416(*(uint *)(local_54b0 + lVar55)));
                            auVar79 = vpsrld_avx512f(auVar78,0x10);
                            auVar81 = vmovdqu16_avx512bw(auVar73);
                            auVar109._2_2_ = auVar81._2_2_;
                            auVar109._0_2_ = auVar78._0_2_;
                            auVar109._4_2_ = auVar78._4_2_;
                            auVar109._6_2_ = auVar81._6_2_;
                            auVar109._8_2_ = auVar78._8_2_;
                            auVar109._10_2_ = auVar81._10_2_;
                            auVar109._12_2_ = auVar78._12_2_;
                            auVar109._14_2_ = auVar81._14_2_;
                            auVar109._16_2_ = auVar78._16_2_;
                            auVar109._18_2_ = auVar81._18_2_;
                            auVar109._20_2_ = auVar78._20_2_;
                            auVar109._22_2_ = auVar81._22_2_;
                            auVar109._24_2_ = auVar78._24_2_;
                            auVar109._26_2_ = auVar81._26_2_;
                            auVar109._28_2_ = auVar78._28_2_;
                            auVar109._30_2_ = auVar81._30_2_;
                            auVar109._32_2_ = auVar78._32_2_;
                            auVar109._34_2_ = auVar81._34_2_;
                            auVar109._36_2_ = auVar78._36_2_;
                            auVar109._38_2_ = auVar81._38_2_;
                            auVar109._40_2_ = auVar78._40_2_;
                            auVar109._42_2_ = auVar81._42_2_;
                            auVar109._44_2_ = auVar78._44_2_;
                            auVar109._46_2_ = auVar81._46_2_;
                            auVar109._48_2_ = auVar78._48_2_;
                            auVar109._50_2_ = auVar81._50_2_;
                            auVar109._52_2_ = auVar78._52_2_;
                            auVar109._54_2_ = auVar81._54_2_;
                            auVar109._56_2_ = auVar78._56_2_;
                            auVar109._58_2_ = auVar81._58_2_;
                            auVar109._62_2_ = auVar81._62_2_;
                            auVar109._60_2_ = auVar78._60_2_;
                            auVar78 = vcvtdq2ps_avx512f(auVar109);
                            auVar78 = vmulps_avx512f(auVar78,auVar103);
                            auVar79 = vcvtdq2ps_avx512f(auVar79);
                            auVar79 = vmulps_avx512f(auVar79,auVar103);
                            auVar81 = vpbroadcastd_avx512f
                                                (ZEXT416(*(uint *)(local_54b8 + lVar55 + 0x2c)));
                            auVar82 = vpsrld_avx512f(auVar81,0x10);
                            auVar73 = vmovdqu16_avx512bw(auVar73);
                            auVar110._2_2_ = auVar73._2_2_;
                            auVar110._0_2_ = auVar81._0_2_;
                            auVar110._4_2_ = auVar81._4_2_;
                            auVar110._6_2_ = auVar73._6_2_;
                            auVar110._8_2_ = auVar81._8_2_;
                            auVar110._10_2_ = auVar73._10_2_;
                            auVar110._12_2_ = auVar81._12_2_;
                            auVar110._14_2_ = auVar73._14_2_;
                            auVar110._16_2_ = auVar81._16_2_;
                            auVar110._18_2_ = auVar73._18_2_;
                            auVar110._20_2_ = auVar81._20_2_;
                            auVar110._22_2_ = auVar73._22_2_;
                            auVar110._24_2_ = auVar81._24_2_;
                            auVar110._26_2_ = auVar73._26_2_;
                            auVar110._28_2_ = auVar81._28_2_;
                            auVar110._30_2_ = auVar73._30_2_;
                            auVar110._32_2_ = auVar81._32_2_;
                            auVar110._34_2_ = auVar73._34_2_;
                            auVar110._36_2_ = auVar81._36_2_;
                            auVar110._38_2_ = auVar73._38_2_;
                            auVar110._40_2_ = auVar81._40_2_;
                            auVar110._42_2_ = auVar73._42_2_;
                            auVar110._44_2_ = auVar81._44_2_;
                            auVar110._46_2_ = auVar73._46_2_;
                            auVar110._48_2_ = auVar81._48_2_;
                            auVar110._50_2_ = auVar73._50_2_;
                            auVar110._52_2_ = auVar81._52_2_;
                            auVar110._54_2_ = auVar73._54_2_;
                            auVar110._56_2_ = auVar81._56_2_;
                            auVar110._58_2_ = auVar73._58_2_;
                            auVar110._62_2_ = auVar73._62_2_;
                            auVar110._60_2_ = auVar81._60_2_;
                            auVar73 = vcvtdq2ps_avx512f(auVar110);
                            auVar73 = vmulps_avx512f(auVar73,auVar103);
                            auVar81 = vcvtdq2ps_avx512f(auVar82);
                            auVar103 = vmulps_avx512f(auVar81,auVar103);
                            auVar130 = vsubps_avx512f(auVar130,auVar70);
                            auVar130 = vsubps_avx512f(auVar130,auVar71);
                            auVar72 = vmulps_avx512f(auVar130,auVar72);
                            auVar130 = vmulps_avx512f(auVar130,auVar77);
                            auVar72 = vfmadd231ps_avx512f(auVar72,auVar71,auVar73);
                            auVar130 = vfmadd231ps_avx512f(auVar130,auVar71,auVar103);
                            local_4f80 = vfmadd231ps_avx512f(auVar72,auVar70,auVar78);
                            local_4fc0 = vfmadd231ps_avx512f(auVar130,auVar70,auVar79);
                            local_50c0._0_8_ = local_4b40._0_8_;
                            local_50c0._8_8_ = local_4b40._8_8_;
                            local_50c0._16_8_ = local_4b40._16_8_;
                            local_50c0._24_8_ = local_4b40._24_8_;
                            local_50c0._32_8_ = local_4b40._32_8_;
                            local_50c0._40_8_ = local_4b40._40_8_;
                            local_50c0._48_8_ = local_4b40._48_8_;
                            local_50c0._56_8_ = local_4b40._56_8_;
                            local_50c0._64_8_ = local_4b80._0_8_;
                            local_50c0._72_8_ = local_4b80._8_8_;
                            local_50c0._80_8_ = local_4b80._16_8_;
                            local_50c0._88_8_ = local_4b80._24_8_;
                            local_50c0._96_8_ = local_4b80._32_8_;
                            local_50c0._104_8_ = local_4b80._40_8_;
                            local_50c0._112_8_ = local_4b80._48_8_;
                            local_50c0._120_8_ = local_4b80._56_8_;
                            local_50c0._128_8_ = local_4bc0._0_8_;
                            local_50c0._136_8_ = local_4bc0._8_8_;
                            local_50c0._144_8_ = local_4bc0._16_8_;
                            local_50c0._152_8_ = local_4bc0._24_8_;
                            local_50c0._160_8_ = local_4bc0._32_8_;
                            local_50c0._168_8_ = local_4bc0._40_8_;
                            local_50c0._176_8_ = local_4bc0._48_8_;
                            local_50c0._184_8_ = local_4bc0._56_8_;
                            local_5000 = local_4b00._0_8_;
                            uStack_4ff8 = local_4b00._8_8_;
                            uStack_4ff0 = local_4b00._16_8_;
                            uStack_4fe8 = local_4b00._24_8_;
                            uStack_4fe0 = local_4b00._32_8_;
                            uStack_4fd8 = local_4b00._40_8_;
                            uStack_4fd0 = local_4b00._48_8_;
                            uStack_4fc8 = local_4b00._56_8_;
                            local_5400._8_8_ = (vfloat_impl<16> *)local_5180;
                            local_5400._0_8_ = &local_4e40;
                            _Stack_53f0._M_head_impl = (vfloat_impl<16> *)local_5140;
                            auStack_53e0 = auVar74._32_32_;
                            _Stack_53e8._M_head_impl = (vfloat_impl<16> *)&local_5100;
                            in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
                            local_5280 = auVar75;
                            local_5240 = auVar76;
                            local_5200 = auVar80;
                            std::
                            _Tuple_impl<0ul,embree::vfloat_impl<16>&,embree::vfloat_impl<16>&,embree::vfloat_impl<16>&,embree::Vec3<embree::vfloat_impl<16>>&>
                            ::
                            _M_assign<embree::vfloat_impl<16>,embree::vfloat_impl<16>,embree::vfloat_impl<16>,embree::Vec3<embree::vfloat_impl<16>>>
                                      ((_Tuple_impl<0UL,_embree::vfloat_impl<16>_&,_embree::vfloat_impl<16>_&,_embree::vfloat_impl<16>_&,_embree::Vec3<embree::vfloat_impl<16>_>_&>
                                        *)local_5400,
                                       (_Tuple_impl<0UL,_embree::vfloat_impl<16>,_embree::vfloat_impl<16>,_embree::vfloat_impl<16>,_embree::Vec3<embree::vfloat_impl<16>_>_>
                                        *)&local_50c0.field_0);
                            pRVar3 = context->user;
                            auVar70 = vpbroadcastd_avx512f();
                            auVar130 = vpbroadcastd_avx512f();
                            local_50c0._0_8_ = local_4e40;
                            local_50c0._8_8_ = uStack_4e38;
                            local_50c0._16_8_ = uStack_4e30;
                            local_50c0._24_8_ = uStack_4e28;
                            local_50c0._32_8_ = uStack_4e20;
                            local_50c0._40_8_ = uStack_4e18;
                            local_50c0._48_8_ = uStack_4e10;
                            local_50c0._56_8_ = uStack_4e08;
                            local_50c0._64_8_ = local_4e00;
                            local_50c0._72_8_ = uStack_4df8;
                            local_50c0._80_8_ = uStack_4df0;
                            local_50c0._88_8_ = uStack_4de8;
                            local_50c0._96_8_ = uStack_4de0;
                            local_50c0._104_8_ = uStack_4dd8;
                            local_50c0._112_8_ = uStack_4dd0;
                            local_50c0._120_8_ = uStack_4dc8;
                            local_50c0._128_8_ = local_4dc0;
                            local_50c0._136_8_ = uStack_4db8;
                            local_50c0._144_8_ = uStack_4db0;
                            local_50c0._152_8_ = uStack_4da8;
                            local_50c0._160_8_ = uStack_4da0;
                            local_50c0._168_8_ = uStack_4d98;
                            local_50c0._176_8_ = uStack_4d90;
                            local_50c0._184_8_ = uStack_4d88;
                            local_5000 = local_5100;
                            uStack_4ff8 = uStack_50f8;
                            uStack_4ff0 = uStack_50f0;
                            uStack_4fe8 = uStack_50e8;
                            uStack_4fe0 = uStack_50e0;
                            uStack_4fd8 = uStack_50d8;
                            uStack_4fd0 = uStack_50d0;
                            uStack_4fc8 = uStack_50c8;
                            local_4f80 = vmovdqa64_avx512f(auVar130);
                            local_4f40 = vmovdqa64_avx512f(auVar70);
                            auVar21 = vpcmpeqd_avx2(auVar70._0_32_,auVar70._0_32_);
                            local_5488[3] = auVar21;
                            local_5488[2] = auVar21;
                            local_5488[1] = auVar21;
                            *local_5488 = auVar21;
                            local_4f00 = vbroadcastss_avx512f(ZEXT416(pRVar3->instID[0]));
                            local_4ec0 = vbroadcastss_avx512f(ZEXT416(pRVar3->instPrimID[0]));
                            local_52c0 = *(undefined1 (*) [64])(ray + 0x200);
                            auVar70 = vblendmps_avx512f(local_52c0,local_5180);
                            bVar44 = (bool)((byte)uVar45 & 1);
                            bVar5 = (bool)((byte)(uVar45 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar45 >> 2) & 1);
                            bVar7 = (bool)((byte)(uVar45 >> 3) & 1);
                            bVar8 = (bool)((byte)(uVar45 >> 4) & 1);
                            bVar9 = (bool)((byte)(uVar45 >> 5) & 1);
                            bVar10 = (bool)((byte)(uVar45 >> 6) & 1);
                            bVar11 = (bool)((byte)(uVar45 >> 7) & 1);
                            bVar12 = (byte)(uVar45 >> 8);
                            bVar13 = (bool)(bVar12 >> 1 & 1);
                            bVar14 = (bool)(bVar12 >> 2 & 1);
                            bVar15 = (bool)(bVar12 >> 3 & 1);
                            bVar16 = (bool)(bVar12 >> 4 & 1);
                            bVar17 = (bool)(bVar12 >> 5 & 1);
                            bVar18 = (bool)(bVar12 >> 6 & 1);
                            *(uint *)(ray + 0x200) =
                                 (uint)bVar44 * auVar70._0_4_ | (uint)!bVar44 * local_4ec0._0_4_;
                            *(uint *)(ray + 0x204) =
                                 (uint)bVar5 * auVar70._4_4_ | (uint)!bVar5 * local_4ec0._4_4_;
                            *(uint *)(ray + 0x208) =
                                 (uint)bVar6 * auVar70._8_4_ | (uint)!bVar6 * local_4ec0._8_4_;
                            *(uint *)(ray + 0x20c) =
                                 (uint)bVar7 * auVar70._12_4_ | (uint)!bVar7 * local_4ec0._12_4_;
                            *(uint *)(ray + 0x210) =
                                 (uint)bVar8 * auVar70._16_4_ | (uint)!bVar8 * local_4ec0._16_4_;
                            *(uint *)(ray + 0x214) =
                                 (uint)bVar9 * auVar70._20_4_ | (uint)!bVar9 * local_4ec0._20_4_;
                            *(uint *)(ray + 0x218) =
                                 (uint)bVar10 * auVar70._24_4_ | (uint)!bVar10 * local_4ec0._24_4_;
                            *(uint *)(ray + 0x21c) =
                                 (uint)bVar11 * auVar70._28_4_ | (uint)!bVar11 * local_4ec0._28_4_;
                            *(uint *)(ray + 0x220) =
                                 (uint)(bVar12 & 1) * auVar70._32_4_ |
                                 (uint)!(bool)(bVar12 & 1) * local_4ec0._32_4_;
                            *(uint *)(ray + 0x224) =
                                 (uint)bVar13 * auVar70._36_4_ | (uint)!bVar13 * local_4ec0._36_4_;
                            *(uint *)(ray + 0x228) =
                                 (uint)bVar14 * auVar70._40_4_ | (uint)!bVar14 * local_4ec0._40_4_;
                            *(uint *)(ray + 0x22c) =
                                 (uint)bVar15 * auVar70._44_4_ | (uint)!bVar15 * local_4ec0._44_4_;
                            *(uint *)(ray + 0x230) =
                                 (uint)bVar16 * auVar70._48_4_ | (uint)!bVar16 * local_4ec0._48_4_;
                            *(uint *)(ray + 0x234) =
                                 (uint)bVar17 * auVar70._52_4_ | (uint)!bVar17 * local_4ec0._52_4_;
                            *(uint *)(ray + 0x238) =
                                 (uint)bVar18 * auVar70._56_4_ | (uint)!bVar18 * local_4ec0._56_4_;
                            *(uint *)(ray + 0x23c) =
                                 (uint)(bVar12 >> 7) * auVar70._60_4_ |
                                 (uint)!(bool)(bVar12 >> 7) * local_4ec0._60_4_;
                            auVar74 = vpmovm2d_avx512dq((ulong)uVar45);
                            _local_5400 = vmovdqa64_avx512f(auVar74);
                            local_5430.valid = (int *)local_5400;
                            local_5430.geometryUserPtr = pGVar2->userPtr;
                            local_5430.context = context->user;
                            local_5430.hit = (RTCHitN *)&local_50c0;
                            local_5430.N = 0x10;
                            local_5430.ray = (RTCRayN *)ray;
                            if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
                              (*pGVar2->occlusionFilterN)(&local_5430);
                              auVar74 = vmovdqa64_avx512f(_local_5400);
                            }
                            uVar22 = vptestmd_avx512f(auVar74,auVar74);
                            if ((short)uVar22 == 0) {
                              uVar67 = 0;
                              auVar70 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                              auVar72 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                              auVar69 = vxorps_avx512vl(auVar69,auVar69);
                              auVar73 = ZEXT1664(auVar69);
                              auVar71 = vbroadcastss_avx512f(ZEXT416(0x34000000));
                              auVar130 = vbroadcastss_avx512f(ZEXT416(0x80000000));
                            }
                            else {
                              p_Var4 = context->args->filter;
                              if (p_Var4 == (RTCFilterFunctionN)0x0) {
                                auVar70 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                                auVar72 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                                auVar69 = vxorps_avx512vl(auVar69,auVar69);
                                auVar73 = ZEXT1664(auVar69);
                                auVar71 = vbroadcastss_avx512f(ZEXT416(0x34000000));
                                auVar130 = vbroadcastss_avx512f(ZEXT416(0x80000000));
                              }
                              else {
                                auVar70 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                                auVar72 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                                auVar69 = vxorps_avx512vl(auVar69,auVar69);
                                auVar73 = ZEXT1664(auVar69);
                                auVar71 = vbroadcastss_avx512f(ZEXT416(0x34000000));
                                auVar130 = vbroadcastss_avx512f(ZEXT416(0x80000000));
                                if (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar2->field_8).field_0x2 & 0x40) != 0)) {
                                  in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
                                  (*p_Var4)(&local_5430);
                                  auVar130 = vbroadcastss_avx512f(ZEXT416(0x80000000));
                                  auVar71 = vbroadcastss_avx512f(ZEXT416(0x34000000));
                                  auVar69 = vxorps_avx512vl(auVar69,auVar69);
                                  auVar73 = ZEXT1664(auVar69);
                                  auVar72 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                                  auVar70 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                                  auVar74 = vmovdqa64_avx512f(_local_5400);
                                }
                              }
                              uVar67 = vptestmd_avx512f(auVar74,auVar74);
                              auVar74 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                              bVar44 = (bool)((byte)uVar67 & 1);
                              bVar5 = (bool)((byte)(uVar67 >> 1) & 1);
                              bVar6 = (bool)((byte)(uVar67 >> 2) & 1);
                              bVar7 = (bool)((byte)(uVar67 >> 3) & 1);
                              bVar8 = (bool)((byte)(uVar67 >> 4) & 1);
                              bVar9 = (bool)((byte)(uVar67 >> 5) & 1);
                              bVar10 = (bool)((byte)(uVar67 >> 6) & 1);
                              bVar11 = (bool)((byte)(uVar67 >> 7) & 1);
                              bVar13 = (bool)((byte)(uVar67 >> 8) & 1);
                              bVar14 = (bool)((byte)(uVar67 >> 9) & 1);
                              bVar15 = (bool)((byte)(uVar67 >> 10) & 1);
                              bVar16 = (bool)((byte)(uVar67 >> 0xb) & 1);
                              bVar17 = (bool)((byte)(uVar67 >> 0xc) & 1);
                              bVar18 = (bool)((byte)(uVar67 >> 0xd) & 1);
                              bVar19 = (bool)((byte)(uVar67 >> 0xe) & 1);
                              bVar20 = SUB81(uVar67 >> 0xf,0);
                              *(uint *)(local_5430.ray + 0x200) =
                                   (uint)bVar44 * auVar74._0_4_ |
                                   (uint)!bVar44 * *(int *)(local_5430.ray + 0x200);
                              *(uint *)(local_5430.ray + 0x204) =
                                   (uint)bVar5 * auVar74._4_4_ |
                                   (uint)!bVar5 * *(int *)(local_5430.ray + 0x204);
                              *(uint *)(local_5430.ray + 0x208) =
                                   (uint)bVar6 * auVar74._8_4_ |
                                   (uint)!bVar6 * *(int *)(local_5430.ray + 0x208);
                              *(uint *)(local_5430.ray + 0x20c) =
                                   (uint)bVar7 * auVar74._12_4_ |
                                   (uint)!bVar7 * *(int *)(local_5430.ray + 0x20c);
                              *(uint *)(local_5430.ray + 0x210) =
                                   (uint)bVar8 * auVar74._16_4_ |
                                   (uint)!bVar8 * *(int *)(local_5430.ray + 0x210);
                              *(uint *)(local_5430.ray + 0x214) =
                                   (uint)bVar9 * auVar74._20_4_ |
                                   (uint)!bVar9 * *(int *)(local_5430.ray + 0x214);
                              *(uint *)(local_5430.ray + 0x218) =
                                   (uint)bVar10 * auVar74._24_4_ |
                                   (uint)!bVar10 * *(int *)(local_5430.ray + 0x218);
                              *(uint *)(local_5430.ray + 0x21c) =
                                   (uint)bVar11 * auVar74._28_4_ |
                                   (uint)!bVar11 * *(int *)(local_5430.ray + 0x21c);
                              *(uint *)(local_5430.ray + 0x220) =
                                   (uint)bVar13 * auVar74._32_4_ |
                                   (uint)!bVar13 * *(int *)(local_5430.ray + 0x220);
                              *(uint *)(local_5430.ray + 0x224) =
                                   (uint)bVar14 * auVar74._36_4_ |
                                   (uint)!bVar14 * *(int *)(local_5430.ray + 0x224);
                              *(uint *)(local_5430.ray + 0x228) =
                                   (uint)bVar15 * auVar74._40_4_ |
                                   (uint)!bVar15 * *(int *)(local_5430.ray + 0x228);
                              *(uint *)(local_5430.ray + 0x22c) =
                                   (uint)bVar16 * auVar74._44_4_ |
                                   (uint)!bVar16 * *(int *)(local_5430.ray + 0x22c);
                              *(uint *)(local_5430.ray + 0x230) =
                                   (uint)bVar17 * auVar74._48_4_ |
                                   (uint)!bVar17 * *(int *)(local_5430.ray + 0x230);
                              *(uint *)(local_5430.ray + 0x234) =
                                   (uint)bVar18 * auVar74._52_4_ |
                                   (uint)!bVar18 * *(int *)(local_5430.ray + 0x234);
                              *(uint *)(local_5430.ray + 0x238) =
                                   (uint)bVar19 * auVar74._56_4_ |
                                   (uint)!bVar19 * *(int *)(local_5430.ray + 0x238);
                              *(uint *)(local_5430.ray + 0x23c) =
                                   (uint)bVar20 * auVar74._60_4_ |
                                   (uint)!bVar20 * *(int *)(local_5430.ray + 0x23c);
                            }
                            uVar45 = (ushort)uVar67;
                            bVar44 = (bool)((byte)uVar67 & 1);
                            bVar5 = (bool)((byte)(uVar67 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar67 >> 2) & 1);
                            bVar7 = (bool)((byte)(uVar67 >> 3) & 1);
                            bVar8 = (bool)((byte)(uVar67 >> 4) & 1);
                            bVar9 = (bool)((byte)(uVar67 >> 5) & 1);
                            bVar10 = (bool)((byte)(uVar67 >> 6) & 1);
                            bVar11 = (bool)((byte)(uVar67 >> 7) & 1);
                            bVar13 = (bool)((byte)(uVar67 >> 8) & 1);
                            bVar14 = (bool)((byte)(uVar67 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar67 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar67 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar67 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar67 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar67 >> 0xe) & 1);
                            bVar20 = SUB81(uVar67 >> 0xf,0);
                            *(uint *)pRVar1 =
                                 (uint)bVar44 * *(int *)pRVar1 | (uint)!bVar44 * local_52c0._0_4_;
                            *(uint *)(ray + 0x204) =
                                 (uint)bVar5 * *(int *)(ray + 0x204) |
                                 (uint)!bVar5 * local_52c0._4_4_;
                            *(uint *)(ray + 0x208) =
                                 (uint)bVar6 * *(int *)(ray + 0x208) |
                                 (uint)!bVar6 * local_52c0._8_4_;
                            *(uint *)(ray + 0x20c) =
                                 (uint)bVar7 * *(int *)(ray + 0x20c) |
                                 (uint)!bVar7 * local_52c0._12_4_;
                            *(uint *)(ray + 0x210) =
                                 (uint)bVar8 * *(int *)(ray + 0x210) |
                                 (uint)!bVar8 * local_52c0._16_4_;
                            *(uint *)(ray + 0x214) =
                                 (uint)bVar9 * *(int *)(ray + 0x214) |
                                 (uint)!bVar9 * local_52c0._20_4_;
                            *(uint *)(ray + 0x218) =
                                 (uint)bVar10 * *(int *)(ray + 0x218) |
                                 (uint)!bVar10 * local_52c0._24_4_;
                            *(uint *)(ray + 0x21c) =
                                 (uint)bVar11 * *(int *)(ray + 0x21c) |
                                 (uint)!bVar11 * local_52c0._28_4_;
                            *(uint *)(ray + 0x220) =
                                 (uint)bVar13 * *(int *)(ray + 0x220) |
                                 (uint)!bVar13 * local_52c0._32_4_;
                            *(uint *)(ray + 0x224) =
                                 (uint)bVar14 * *(int *)(ray + 0x224) |
                                 (uint)!bVar14 * local_52c0._36_4_;
                            *(uint *)(ray + 0x228) =
                                 (uint)bVar15 * *(int *)(ray + 0x228) |
                                 (uint)!bVar15 * local_52c0._40_4_;
                            *(uint *)(ray + 0x22c) =
                                 (uint)bVar16 * *(int *)(ray + 0x22c) |
                                 (uint)!bVar16 * local_52c0._44_4_;
                            *(uint *)(ray + 0x230) =
                                 (uint)bVar17 * *(int *)(ray + 0x230) |
                                 (uint)!bVar17 * local_52c0._48_4_;
                            *(uint *)(ray + 0x234) =
                                 (uint)bVar18 * *(int *)(ray + 0x234) |
                                 (uint)!bVar18 * local_52c0._52_4_;
                            *(uint *)(ray + 0x238) =
                                 (uint)bVar19 * *(int *)(ray + 0x238) |
                                 (uint)!bVar19 * local_52c0._56_4_;
                            *(uint *)(ray + 0x23c) =
                                 (uint)bVar20 * *(int *)(ray + 0x23c) |
                                 (uint)!bVar20 * local_52c0._60_4_;
                            auVar75 = local_5280;
                            auVar80 = local_5200;
                            auVar76 = local_5240;
                          }
                          uVar46 = uVar46 & (ushort)~uVar45;
                        }
                        auVar74 = _local_5400;
                        auVar69 = auVar73._0_16_;
                        if ((ushort)uVar46 == 0) break;
                        auVar77 = *(undefined1 (*) [64])ray;
                        auVar103 = *(undefined1 (*) [64])(ray + 0x40);
                        auVar78 = *(undefined1 (*) [64])(ray + 0x80);
                        auVar79 = *(undefined1 (*) [64])(ray + 0x100);
                        auVar81 = *(undefined1 (*) [64])(ray + 0x140);
                        auVar82 = *(undefined1 (*) [64])(ray + 0x180);
                        auVar83 = vsubps_avx512f(local_51c0,auVar77);
                        auVar84 = vsubps_avx512f(local_4900,auVar103);
                        auVar85 = vsubps_avx512f(local_4940,auVar78);
                        auVar80 = vsubps_avx512f(auVar80,auVar77);
                        auVar86 = vsubps_avx512f(local_5340,auVar103);
                        auVar87 = vsubps_avx512f(local_5300,auVar78);
                        auVar77 = vsubps_avx512f(local_4980,auVar77);
                        auVar76 = vsubps_avx512f(auVar76,auVar103);
                        auVar75 = vsubps_avx512f(auVar75,auVar78);
                        auVar103 = vsubps_avx512f(auVar77,auVar83);
                        auVar78 = vsubps_avx512f(auVar76,auVar84);
                        in_ZMM11 = vsubps_avx512f(auVar75,auVar85);
                        auVar88 = vsubps_avx512f(auVar83,auVar80);
                        auVar89 = vsubps_avx512f(auVar84,auVar86);
                        auVar90 = vsubps_avx512f(auVar85,auVar87);
                        auVar91 = vsubps_avx512f(auVar80,auVar77);
                        auVar92 = vsubps_avx512f(auVar86,auVar76);
                        auVar93 = vsubps_avx512f(auVar87,auVar75);
                        auVar94 = vaddps_avx512f(auVar77,auVar83);
                        auVar95 = vaddps_avx512f(auVar76,auVar84);
                        auVar96 = vaddps_avx512f(auVar75,auVar85);
                        auVar97 = vmulps_avx512f(auVar95,in_ZMM11);
                        auVar97 = vfmsub231ps_avx512f(auVar97,auVar78,auVar96);
                        auVar96 = vmulps_avx512f(auVar96,auVar103);
                        auVar96 = vfmsub231ps_avx512f(auVar96,in_ZMM11,auVar94);
                        auVar94 = vmulps_avx512f(auVar94,auVar78);
                        auVar94 = vfmsub231ps_avx512f(auVar94,auVar103,auVar95);
                        auVar94 = vmulps_avx512f(auVar94,auVar82);
                        auVar94 = vfmadd231ps_avx512f(auVar94,auVar81,auVar96);
                        auVar94 = vfmadd231ps_avx512f(auVar94,auVar79,auVar97);
                        auVar95 = vaddps_avx512f(auVar83,auVar80);
                        auVar96 = vaddps_avx512f(auVar84,auVar86);
                        auVar97 = vaddps_avx512f(auVar85,auVar87);
                        auVar98 = vmulps_avx512f(auVar96,auVar90);
                        auVar98 = vfmsub231ps_avx512f(auVar98,auVar89,auVar97);
                        auVar97 = vmulps_avx512f(auVar97,auVar88);
                        auVar97 = vfmsub231ps_avx512f(auVar97,auVar90,auVar95);
                        auVar95 = vmulps_avx512f(auVar95,auVar89);
                        auVar95 = vfmsub231ps_avx512f(auVar95,auVar88,auVar96);
                        auVar95 = vmulps_avx512f(auVar95,auVar82);
                        auVar95 = vfmadd231ps_avx512f(auVar95,auVar81,auVar97);
                        auVar95 = vfmadd231ps_avx512f(auVar95,auVar79,auVar98);
                        auVar77 = vaddps_avx512f(auVar80,auVar77);
                        auVar76 = vaddps_avx512f(auVar86,auVar76);
                        auVar75 = vaddps_avx512f(auVar87,auVar75);
                        auVar80 = vmulps_avx512f(auVar76,auVar93);
                        auVar80 = vfmsub231ps_avx512f(auVar80,auVar92,auVar75);
                        auVar75 = vmulps_avx512f(auVar75,auVar91);
                        auVar75 = vfmsub231ps_avx512f(auVar75,auVar93,auVar77);
                        auVar77 = vmulps_avx512f(auVar77,auVar92);
                        auVar76 = vfmsub231ps_avx512f(auVar77,auVar91,auVar76);
                        auVar76 = vmulps_avx512f(auVar76,auVar82);
                        auVar75 = vfmadd231ps_avx512f(auVar76,auVar81,auVar75);
                        auVar75 = vfmadd231ps_avx512f(auVar75,auVar79,auVar80);
                        auVar76 = vaddps_avx512f(auVar94,auVar95);
                        auVar76 = vaddps_avx512f(auVar75,auVar76);
                        auVar77 = vandps_avx512dq(auVar76,auVar70);
                        auVar77 = vmulps_avx512f(auVar77,auVar71);
                        auVar80 = vminps_avx512f(auVar94,auVar95);
                        auVar80 = vminps_avx512f(auVar80,auVar75);
                        auVar86 = vxorps_avx512dq(auVar77,auVar130);
                        uVar22 = vcmpps_avx512f(auVar80,auVar86,5);
                        auVar80 = vmaxps_avx512f(auVar94,auVar95);
                        auVar75 = vmaxps_avx512f(auVar80,auVar75);
                        uVar23 = vcmpps_avx512f(auVar75,auVar77,2);
                        uVar45 = ((ushort)uVar22 | (ushort)uVar23) & (ushort)uVar46;
                        if (uVar45 == 0) {
LAB_01ebc084:
                          uVar45 = 0;
                        }
                        else {
                          auVar75 = vmulps_avx512f(auVar89,in_ZMM11);
                          auVar77 = vmulps_avx512f(auVar103,auVar90);
                          auVar80 = vmulps_avx512f(auVar88,auVar78);
                          auVar86 = vmulps_avx512f(auVar92,auVar90);
                          auVar87 = vmulps_avx512f(auVar88,auVar93);
                          auVar96 = vmulps_avx512f(auVar91,auVar89);
                          auVar78 = vfmsub213ps_avx512f(auVar78,auVar90,auVar75);
                          in_ZMM11 = vfmsub213ps_avx512f(in_ZMM11,auVar88,auVar77);
                          auVar103 = vfmsub213ps_avx512f(auVar103,auVar89,auVar80);
                          auVar89 = vfmsub213ps_avx512f(auVar93,auVar89,auVar86);
                          auVar90 = vfmsub213ps_avx512f(auVar91,auVar90,auVar87);
                          auVar88 = vfmsub213ps_avx512f(auVar92,auVar88,auVar96);
                          auVar75 = vandps_avx512dq(auVar75,auVar70);
                          auVar86 = vandps_avx512dq(auVar86,auVar70);
                          uVar67 = vcmpps_avx512f(auVar75,auVar86,1);
                          auVar75 = vandps_avx512dq(auVar77,auVar70);
                          auVar77 = vandps_avx512dq(auVar87,auVar70);
                          uVar66 = vcmpps_avx512f(auVar75,auVar77,1);
                          auVar75 = vandps_avx512dq(auVar80,auVar70);
                          auVar77 = vandps_avx512dq(auVar96,auVar70);
                          uVar53 = vcmpps_avx512f(auVar75,auVar77,1);
                          bVar44 = (bool)((byte)uVar67 & 1);
                          auVar104._0_4_ =
                               (uint)bVar44 * auVar78._0_4_ | (uint)!bVar44 * auVar89._0_4_;
                          bVar44 = (bool)((byte)(uVar67 >> 1) & 1);
                          auVar104._4_4_ =
                               (uint)bVar44 * auVar78._4_4_ | (uint)!bVar44 * auVar89._4_4_;
                          bVar44 = (bool)((byte)(uVar67 >> 2) & 1);
                          auVar104._8_4_ =
                               (uint)bVar44 * auVar78._8_4_ | (uint)!bVar44 * auVar89._8_4_;
                          bVar44 = (bool)((byte)(uVar67 >> 3) & 1);
                          auVar104._12_4_ =
                               (uint)bVar44 * auVar78._12_4_ | (uint)!bVar44 * auVar89._12_4_;
                          bVar44 = (bool)((byte)(uVar67 >> 4) & 1);
                          auVar104._16_4_ =
                               (uint)bVar44 * auVar78._16_4_ | (uint)!bVar44 * auVar89._16_4_;
                          bVar44 = (bool)((byte)(uVar67 >> 5) & 1);
                          auVar104._20_4_ =
                               (uint)bVar44 * auVar78._20_4_ | (uint)!bVar44 * auVar89._20_4_;
                          bVar44 = (bool)((byte)(uVar67 >> 6) & 1);
                          auVar104._24_4_ =
                               (uint)bVar44 * auVar78._24_4_ | (uint)!bVar44 * auVar89._24_4_;
                          bVar44 = (bool)((byte)(uVar67 >> 7) & 1);
                          auVar104._28_4_ =
                               (uint)bVar44 * auVar78._28_4_ | (uint)!bVar44 * auVar89._28_4_;
                          bVar44 = (bool)((byte)(uVar67 >> 8) & 1);
                          auVar104._32_4_ =
                               (uint)bVar44 * auVar78._32_4_ | (uint)!bVar44 * auVar89._32_4_;
                          bVar44 = (bool)((byte)(uVar67 >> 9) & 1);
                          auVar104._36_4_ =
                               (uint)bVar44 * auVar78._36_4_ | (uint)!bVar44 * auVar89._36_4_;
                          bVar44 = (bool)((byte)(uVar67 >> 10) & 1);
                          auVar104._40_4_ =
                               (uint)bVar44 * auVar78._40_4_ | (uint)!bVar44 * auVar89._40_4_;
                          bVar44 = (bool)((byte)(uVar67 >> 0xb) & 1);
                          auVar104._44_4_ =
                               (uint)bVar44 * auVar78._44_4_ | (uint)!bVar44 * auVar89._44_4_;
                          bVar44 = (bool)((byte)(uVar67 >> 0xc) & 1);
                          auVar104._48_4_ =
                               (uint)bVar44 * auVar78._48_4_ | (uint)!bVar44 * auVar89._48_4_;
                          bVar44 = (bool)((byte)(uVar67 >> 0xd) & 1);
                          auVar104._52_4_ =
                               (uint)bVar44 * auVar78._52_4_ | (uint)!bVar44 * auVar89._52_4_;
                          bVar44 = (bool)((byte)(uVar67 >> 0xe) & 1);
                          auVar104._56_4_ =
                               (uint)bVar44 * auVar78._56_4_ | (uint)!bVar44 * auVar89._56_4_;
                          bVar44 = SUB81(uVar67 >> 0xf,0);
                          auVar104._60_4_ =
                               (uint)bVar44 * auVar78._60_4_ | (uint)!bVar44 * auVar89._60_4_;
                          bVar44 = (bool)((byte)uVar66 & 1);
                          auVar105._0_4_ =
                               (uint)bVar44 * in_ZMM11._0_4_ | (uint)!bVar44 * auVar90._0_4_;
                          bVar44 = (bool)((byte)(uVar66 >> 1) & 1);
                          auVar105._4_4_ =
                               (uint)bVar44 * in_ZMM11._4_4_ | (uint)!bVar44 * auVar90._4_4_;
                          bVar44 = (bool)((byte)(uVar66 >> 2) & 1);
                          auVar105._8_4_ =
                               (uint)bVar44 * in_ZMM11._8_4_ | (uint)!bVar44 * auVar90._8_4_;
                          bVar44 = (bool)((byte)(uVar66 >> 3) & 1);
                          auVar105._12_4_ =
                               (uint)bVar44 * in_ZMM11._12_4_ | (uint)!bVar44 * auVar90._12_4_;
                          bVar44 = (bool)((byte)(uVar66 >> 4) & 1);
                          auVar105._16_4_ =
                               (uint)bVar44 * in_ZMM11._16_4_ | (uint)!bVar44 * auVar90._16_4_;
                          bVar44 = (bool)((byte)(uVar66 >> 5) & 1);
                          auVar105._20_4_ =
                               (uint)bVar44 * in_ZMM11._20_4_ | (uint)!bVar44 * auVar90._20_4_;
                          bVar44 = (bool)((byte)(uVar66 >> 6) & 1);
                          auVar105._24_4_ =
                               (uint)bVar44 * in_ZMM11._24_4_ | (uint)!bVar44 * auVar90._24_4_;
                          bVar44 = (bool)((byte)(uVar66 >> 7) & 1);
                          auVar105._28_4_ =
                               (uint)bVar44 * in_ZMM11._28_4_ | (uint)!bVar44 * auVar90._28_4_;
                          bVar44 = (bool)((byte)(uVar66 >> 8) & 1);
                          auVar105._32_4_ =
                               (uint)bVar44 * in_ZMM11._32_4_ | (uint)!bVar44 * auVar90._32_4_;
                          bVar44 = (bool)((byte)(uVar66 >> 9) & 1);
                          auVar105._36_4_ =
                               (uint)bVar44 * in_ZMM11._36_4_ | (uint)!bVar44 * auVar90._36_4_;
                          bVar44 = (bool)((byte)(uVar66 >> 10) & 1);
                          auVar105._40_4_ =
                               (uint)bVar44 * in_ZMM11._40_4_ | (uint)!bVar44 * auVar90._40_4_;
                          bVar44 = (bool)((byte)(uVar66 >> 0xb) & 1);
                          auVar105._44_4_ =
                               (uint)bVar44 * in_ZMM11._44_4_ | (uint)!bVar44 * auVar90._44_4_;
                          bVar44 = (bool)((byte)(uVar66 >> 0xc) & 1);
                          auVar105._48_4_ =
                               (uint)bVar44 * in_ZMM11._48_4_ | (uint)!bVar44 * auVar90._48_4_;
                          bVar44 = (bool)((byte)(uVar66 >> 0xd) & 1);
                          auVar105._52_4_ =
                               (uint)bVar44 * in_ZMM11._52_4_ | (uint)!bVar44 * auVar90._52_4_;
                          bVar44 = (bool)((byte)(uVar66 >> 0xe) & 1);
                          auVar105._56_4_ =
                               (uint)bVar44 * in_ZMM11._56_4_ | (uint)!bVar44 * auVar90._56_4_;
                          bVar44 = SUB81(uVar66 >> 0xf,0);
                          auVar105._60_4_ =
                               (uint)bVar44 * in_ZMM11._60_4_ | (uint)!bVar44 * auVar90._60_4_;
                          bVar44 = (bool)((byte)uVar53 & 1);
                          auVar106._0_4_ =
                               (uint)bVar44 * auVar103._0_4_ | (uint)!bVar44 * auVar88._0_4_;
                          bVar44 = (bool)((byte)(uVar53 >> 1) & 1);
                          auVar106._4_4_ =
                               (uint)bVar44 * auVar103._4_4_ | (uint)!bVar44 * auVar88._4_4_;
                          bVar44 = (bool)((byte)(uVar53 >> 2) & 1);
                          auVar106._8_4_ =
                               (uint)bVar44 * auVar103._8_4_ | (uint)!bVar44 * auVar88._8_4_;
                          bVar44 = (bool)((byte)(uVar53 >> 3) & 1);
                          auVar106._12_4_ =
                               (uint)bVar44 * auVar103._12_4_ | (uint)!bVar44 * auVar88._12_4_;
                          bVar44 = (bool)((byte)(uVar53 >> 4) & 1);
                          auVar106._16_4_ =
                               (uint)bVar44 * auVar103._16_4_ | (uint)!bVar44 * auVar88._16_4_;
                          bVar44 = (bool)((byte)(uVar53 >> 5) & 1);
                          auVar106._20_4_ =
                               (uint)bVar44 * auVar103._20_4_ | (uint)!bVar44 * auVar88._20_4_;
                          bVar44 = (bool)((byte)(uVar53 >> 6) & 1);
                          auVar106._24_4_ =
                               (uint)bVar44 * auVar103._24_4_ | (uint)!bVar44 * auVar88._24_4_;
                          bVar44 = (bool)((byte)(uVar53 >> 7) & 1);
                          auVar106._28_4_ =
                               (uint)bVar44 * auVar103._28_4_ | (uint)!bVar44 * auVar88._28_4_;
                          bVar44 = (bool)((byte)(uVar53 >> 8) & 1);
                          auVar106._32_4_ =
                               (uint)bVar44 * auVar103._32_4_ | (uint)!bVar44 * auVar88._32_4_;
                          bVar44 = (bool)((byte)(uVar53 >> 9) & 1);
                          auVar106._36_4_ =
                               (uint)bVar44 * auVar103._36_4_ | (uint)!bVar44 * auVar88._36_4_;
                          bVar44 = (bool)((byte)(uVar53 >> 10) & 1);
                          auVar106._40_4_ =
                               (uint)bVar44 * auVar103._40_4_ | (uint)!bVar44 * auVar88._40_4_;
                          bVar44 = (bool)((byte)(uVar53 >> 0xb) & 1);
                          auVar106._44_4_ =
                               (uint)bVar44 * auVar103._44_4_ | (uint)!bVar44 * auVar88._44_4_;
                          bVar44 = (bool)((byte)(uVar53 >> 0xc) & 1);
                          auVar106._48_4_ =
                               (uint)bVar44 * auVar103._48_4_ | (uint)!bVar44 * auVar88._48_4_;
                          bVar44 = (bool)((byte)(uVar53 >> 0xd) & 1);
                          auVar106._52_4_ =
                               (uint)bVar44 * auVar103._52_4_ | (uint)!bVar44 * auVar88._52_4_;
                          bVar44 = (bool)((byte)(uVar53 >> 0xe) & 1);
                          auVar106._56_4_ =
                               (uint)bVar44 * auVar103._56_4_ | (uint)!bVar44 * auVar88._56_4_;
                          bVar44 = SUB81(uVar53 >> 0xf,0);
                          auVar106._60_4_ =
                               (uint)bVar44 * auVar103._60_4_ | (uint)!bVar44 * auVar88._60_4_;
                          auVar75 = vmulps_avx512f(auVar82,auVar106);
                          auVar75 = vfmadd213ps_avx512f(auVar81,auVar105,auVar75);
                          auVar75 = vfmadd213ps_avx512f(auVar79,auVar104,auVar75);
                          auVar75 = vaddps_avx512f(auVar75,auVar75);
                          auVar77 = vmulps_avx512f(auVar85,auVar106);
                          auVar77 = vfmadd213ps_avx512f(auVar84,auVar105,auVar77);
                          auVar77 = vfmadd213ps_avx512f(auVar83,auVar104,auVar77);
                          auVar103 = vrcp14ps_avx512f(auVar75);
                          auVar77 = vaddps_avx512f(auVar77,auVar77);
                          auVar41._8_4_ = 0x3f800000;
                          auVar41._0_8_ = 0x3f8000003f800000;
                          auVar41._12_4_ = 0x3f800000;
                          auVar41._16_4_ = 0x3f800000;
                          auVar41._20_4_ = 0x3f800000;
                          auVar41._24_4_ = 0x3f800000;
                          auVar41._28_4_ = 0x3f800000;
                          auVar41._32_4_ = 0x3f800000;
                          auVar41._36_4_ = 0x3f800000;
                          auVar41._40_4_ = 0x3f800000;
                          auVar41._44_4_ = 0x3f800000;
                          auVar41._48_4_ = 0x3f800000;
                          auVar41._52_4_ = 0x3f800000;
                          auVar41._56_4_ = 0x3f800000;
                          auVar41._60_4_ = 0x3f800000;
                          auVar78 = vfnmadd213ps_avx512f(auVar103,auVar75,auVar41);
                          auVar103 = vfmadd132ps_avx512f(auVar78,auVar103,auVar103);
                          auVar77 = vmulps_avx512f(auVar77,auVar103);
                          uVar22 = vcmpps_avx512f(auVar77,*(undefined1 (*) [64])(ray + 0x200),2);
                          uVar23 = vcmpps_avx512f(auVar77,*(undefined1 (*) [64])(ray + 0xc0),0xd);
                          uVar24 = vcmpps_avx512f(auVar75,auVar73,4);
                          uVar45 = uVar45 & (ushort)uVar22 & (ushort)uVar23 & (ushort)uVar24;
                          if (uVar45 == 0) goto LAB_01ebc084;
                          local_4c00 = auVar94;
                          local_4c40 = auVar95;
                          local_4c80 = auVar76;
                          local_4cc0 = auVar77;
                          local_4d00 = auVar104;
                          local_4d40 = auVar105;
                          local_4d80 = auVar106;
                        }
                        pGVar2 = (context->scene->geometries).items
                                 [*(uint *)(local_5498.super_Precalculations.grid + 0x18)].ptr;
                        auVar75 = vpbroadcastd_avx512f(ZEXT416(pGVar2->mask));
                        uVar22 = vptestmd_avx512f(auVar75,*(undefined1 (*) [64])(ray + 0x240));
                        uVar45 = (ushort)uVar22 & uVar45;
                        if (uVar45 != 0) {
                          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                             (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            auVar70 = vandps_avx512dq(local_4c80,auVar70);
                            auVar130._8_4_ = 0x219392ef;
                            auVar130._0_8_ = 0x219392ef219392ef;
                            auVar130._12_4_ = 0x219392ef;
                            auVar130._16_4_ = 0x219392ef;
                            auVar130._20_4_ = 0x219392ef;
                            auVar130._24_4_ = 0x219392ef;
                            auVar130._28_4_ = 0x219392ef;
                            auVar130._32_4_ = 0x219392ef;
                            auVar130._36_4_ = 0x219392ef;
                            auVar130._40_4_ = 0x219392ef;
                            auVar130._44_4_ = 0x219392ef;
                            auVar130._48_4_ = 0x219392ef;
                            auVar130._52_4_ = 0x219392ef;
                            auVar130._56_4_ = 0x219392ef;
                            auVar130._60_4_ = 0x219392ef;
                            uVar67 = vcmpps_avx512f(auVar70,auVar130,5);
                            auVar70 = vrcp14ps_avx512f(local_4c80);
                            auVar130 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                            auVar71 = vfnmadd213ps_avx512f(auVar70,local_4c80,auVar130);
                            auVar70 = vfmadd132ps_avx512f(auVar71,auVar70,auVar70);
                            auVar111._4_4_ = (uint)((byte)(uVar67 >> 1) & 1) * auVar70._4_4_;
                            auVar111._0_4_ = (uint)((byte)uVar67 & 1) * auVar70._0_4_;
                            auVar111._8_4_ = (uint)((byte)(uVar67 >> 2) & 1) * auVar70._8_4_;
                            auVar111._12_4_ = (uint)((byte)(uVar67 >> 3) & 1) * auVar70._12_4_;
                            auVar111._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * auVar70._16_4_;
                            auVar111._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * auVar70._20_4_;
                            auVar111._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * auVar70._24_4_;
                            auVar111._28_4_ = (uint)((byte)(uVar67 >> 7) & 1) * auVar70._28_4_;
                            auVar111._32_4_ = (uint)((byte)(uVar67 >> 8) & 1) * auVar70._32_4_;
                            auVar111._36_4_ = (uint)((byte)(uVar67 >> 9) & 1) * auVar70._36_4_;
                            auVar111._40_4_ = (uint)((byte)(uVar67 >> 10) & 1) * auVar70._40_4_;
                            auVar111._44_4_ = (uint)((byte)(uVar67 >> 0xb) & 1) * auVar70._44_4_;
                            auVar111._48_4_ = (uint)((byte)(uVar67 >> 0xc) & 1) * auVar70._48_4_;
                            auVar111._52_4_ = (uint)((byte)(uVar67 >> 0xd) & 1) * auVar70._52_4_;
                            auVar111._56_4_ = (uint)((byte)(uVar67 >> 0xe) & 1) * auVar70._56_4_;
                            auVar111._60_4_ = (uint)(byte)(uVar67 >> 0xf) * auVar70._60_4_;
                            auVar70 = vmulps_avx512f(auVar111,local_4c00);
                            auVar70 = vminps_avx512f(auVar70,auVar130);
                            auVar71 = vmulps_avx512f(auVar111,local_4c40);
                            auVar71 = vminps_avx512f(auVar71,auVar130);
                            local_5340._0_4_ =
                                 *(undefined4 *)(local_5498.super_Precalculations.grid + 0x1c);
                            auVar72 = vpbroadcastd_avx512f
                                                (ZEXT416(*(uint *)(local_54b8 + lVar55 + 0x2c)));
                            auVar75 = vpsrld_avx512f(auVar72,0x10);
                            auVar76 = vmovdqu16_avx512bw(auVar73);
                            auVar112._2_2_ = auVar76._2_2_;
                            auVar112._0_2_ = auVar72._0_2_;
                            auVar112._4_2_ = auVar72._4_2_;
                            auVar112._6_2_ = auVar76._6_2_;
                            auVar112._8_2_ = auVar72._8_2_;
                            auVar112._10_2_ = auVar76._10_2_;
                            auVar112._12_2_ = auVar72._12_2_;
                            auVar112._14_2_ = auVar76._14_2_;
                            auVar112._16_2_ = auVar72._16_2_;
                            auVar112._18_2_ = auVar76._18_2_;
                            auVar112._20_2_ = auVar72._20_2_;
                            auVar112._22_2_ = auVar76._22_2_;
                            auVar112._24_2_ = auVar72._24_2_;
                            auVar112._26_2_ = auVar76._26_2_;
                            auVar112._28_2_ = auVar72._28_2_;
                            auVar112._30_2_ = auVar76._30_2_;
                            auVar112._32_2_ = auVar72._32_2_;
                            auVar112._34_2_ = auVar76._34_2_;
                            auVar112._36_2_ = auVar72._36_2_;
                            auVar112._38_2_ = auVar76._38_2_;
                            auVar112._40_2_ = auVar72._40_2_;
                            auVar112._42_2_ = auVar76._42_2_;
                            auVar112._44_2_ = auVar72._44_2_;
                            auVar112._46_2_ = auVar76._46_2_;
                            auVar112._48_2_ = auVar72._48_2_;
                            auVar112._50_2_ = auVar76._50_2_;
                            auVar112._52_2_ = auVar72._52_2_;
                            auVar112._54_2_ = auVar76._54_2_;
                            auVar112._56_2_ = auVar72._56_2_;
                            auVar112._58_2_ = auVar76._58_2_;
                            auVar112._62_2_ = auVar76._62_2_;
                            auVar112._60_2_ = auVar72._60_2_;
                            auVar72 = vcvtdq2ps_avx512f(auVar112);
                            auVar76 = vbroadcastss_avx512f(ZEXT416(0x39000000));
                            auVar72 = vmulps_avx512f(auVar72,auVar76);
                            auVar75 = vcvtdq2ps_avx512f(auVar75);
                            auVar75 = vmulps_avx512f(auVar75,auVar76);
                            auVar77 = vpbroadcastd_avx512f(ZEXT416(*(uint *)(local_54b0 + lVar55)));
                            auVar103 = vpsrld_avx512f(auVar77,0x10);
                            auVar78 = vmovdqu16_avx512bw(auVar73);
                            auVar113._2_2_ = auVar78._2_2_;
                            auVar113._0_2_ = auVar77._0_2_;
                            auVar113._4_2_ = auVar77._4_2_;
                            auVar113._6_2_ = auVar78._6_2_;
                            auVar113._8_2_ = auVar77._8_2_;
                            auVar113._10_2_ = auVar78._10_2_;
                            auVar113._12_2_ = auVar77._12_2_;
                            auVar113._14_2_ = auVar78._14_2_;
                            auVar113._16_2_ = auVar77._16_2_;
                            auVar113._18_2_ = auVar78._18_2_;
                            auVar113._20_2_ = auVar77._20_2_;
                            auVar113._22_2_ = auVar78._22_2_;
                            auVar113._24_2_ = auVar77._24_2_;
                            auVar113._26_2_ = auVar78._26_2_;
                            auVar113._28_2_ = auVar77._28_2_;
                            auVar113._30_2_ = auVar78._30_2_;
                            auVar113._32_2_ = auVar77._32_2_;
                            auVar113._34_2_ = auVar78._34_2_;
                            auVar113._36_2_ = auVar77._36_2_;
                            auVar113._38_2_ = auVar78._38_2_;
                            auVar113._40_2_ = auVar77._40_2_;
                            auVar113._42_2_ = auVar78._42_2_;
                            auVar113._44_2_ = auVar77._44_2_;
                            auVar113._46_2_ = auVar78._46_2_;
                            auVar113._48_2_ = auVar77._48_2_;
                            auVar113._50_2_ = auVar78._50_2_;
                            auVar113._52_2_ = auVar77._52_2_;
                            auVar113._54_2_ = auVar78._54_2_;
                            auVar113._56_2_ = auVar77._56_2_;
                            auVar113._58_2_ = auVar78._58_2_;
                            auVar113._62_2_ = auVar78._62_2_;
                            auVar113._60_2_ = auVar77._60_2_;
                            auVar77 = vcvtdq2ps_avx512f(auVar113);
                            auVar77 = vmulps_avx512f(auVar77,auVar76);
                            auVar103 = vcvtdq2ps_avx512f(auVar103);
                            auVar103 = vmulps_avx512f(auVar103,auVar76);
                            auVar78 = vpbroadcastd_avx512f
                                                (ZEXT416(*(uint *)(local_54b8 + lVar55 + 0x30)));
                            auVar79 = vpsrld_avx512f(auVar78,0x10);
                            auVar73 = vmovdqu16_avx512bw(auVar73);
                            auVar114._2_2_ = auVar73._2_2_;
                            auVar114._0_2_ = auVar78._0_2_;
                            auVar114._4_2_ = auVar78._4_2_;
                            auVar114._6_2_ = auVar73._6_2_;
                            auVar114._8_2_ = auVar78._8_2_;
                            auVar114._10_2_ = auVar73._10_2_;
                            auVar114._12_2_ = auVar78._12_2_;
                            auVar114._14_2_ = auVar73._14_2_;
                            auVar114._16_2_ = auVar78._16_2_;
                            auVar114._18_2_ = auVar73._18_2_;
                            auVar114._20_2_ = auVar78._20_2_;
                            auVar114._22_2_ = auVar73._22_2_;
                            auVar114._24_2_ = auVar78._24_2_;
                            auVar114._26_2_ = auVar73._26_2_;
                            auVar114._28_2_ = auVar78._28_2_;
                            auVar114._30_2_ = auVar73._30_2_;
                            auVar114._32_2_ = auVar78._32_2_;
                            auVar114._34_2_ = auVar73._34_2_;
                            auVar114._36_2_ = auVar78._36_2_;
                            auVar114._38_2_ = auVar73._38_2_;
                            auVar114._40_2_ = auVar78._40_2_;
                            auVar114._42_2_ = auVar73._42_2_;
                            auVar114._44_2_ = auVar78._44_2_;
                            auVar114._46_2_ = auVar73._46_2_;
                            auVar114._48_2_ = auVar78._48_2_;
                            auVar114._50_2_ = auVar73._50_2_;
                            auVar114._52_2_ = auVar78._52_2_;
                            auVar114._54_2_ = auVar73._54_2_;
                            auVar114._56_2_ = auVar78._56_2_;
                            auVar114._58_2_ = auVar73._58_2_;
                            auVar114._62_2_ = auVar73._62_2_;
                            auVar114._60_2_ = auVar78._60_2_;
                            auVar73 = vcvtdq2ps_avx512f(auVar114);
                            auVar73 = vmulps_avx512f(auVar73,auVar76);
                            auVar78 = vcvtdq2ps_avx512f(auVar79);
                            auVar76 = vmulps_avx512f(auVar78,auVar76);
                            auVar130 = vsubps_avx512f(auVar130,auVar70);
                            auVar130 = vsubps_avx512f(auVar130,auVar71);
                            auVar72 = vmulps_avx512f(auVar130,auVar72);
                            auVar130 = vmulps_avx512f(auVar130,auVar75);
                            auVar72 = vfmadd231ps_avx512f(auVar72,auVar71,auVar73);
                            auVar130 = vfmadd231ps_avx512f(auVar130,auVar71,auVar76);
                            local_4f80 = vfmadd231ps_avx512f(auVar72,auVar70,auVar77);
                            local_4fc0 = vfmadd231ps_avx512f(auVar130,auVar70,auVar103);
                            local_50c0._0_8_ = local_4d00._0_8_;
                            local_50c0._8_8_ = local_4d00._8_8_;
                            local_50c0._16_8_ = local_4d00._16_8_;
                            local_50c0._24_8_ = local_4d00._24_8_;
                            local_50c0._32_8_ = local_4d00._32_8_;
                            local_50c0._40_8_ = local_4d00._40_8_;
                            local_50c0._48_8_ = local_4d00._48_8_;
                            local_50c0._56_8_ = local_4d00._56_8_;
                            local_50c0._64_8_ = local_4d40._0_8_;
                            local_50c0._72_8_ = local_4d40._8_8_;
                            local_50c0._80_8_ = local_4d40._16_8_;
                            local_50c0._88_8_ = local_4d40._24_8_;
                            local_50c0._96_8_ = local_4d40._32_8_;
                            local_50c0._104_8_ = local_4d40._40_8_;
                            local_50c0._112_8_ = local_4d40._48_8_;
                            local_50c0._120_8_ = local_4d40._56_8_;
                            local_50c0._128_8_ = local_4d80._0_8_;
                            local_50c0._136_8_ = local_4d80._8_8_;
                            local_50c0._144_8_ = local_4d80._16_8_;
                            local_50c0._152_8_ = local_4d80._24_8_;
                            local_50c0._160_8_ = local_4d80._32_8_;
                            local_50c0._168_8_ = local_4d80._40_8_;
                            local_50c0._176_8_ = local_4d80._48_8_;
                            local_50c0._184_8_ = local_4d80._56_8_;
                            local_5000 = local_4cc0._0_8_;
                            uStack_4ff8 = local_4cc0._8_8_;
                            uStack_4ff0 = local_4cc0._16_8_;
                            uStack_4fe8 = local_4cc0._24_8_;
                            uStack_4fe0 = local_4cc0._32_8_;
                            uStack_4fd8 = local_4cc0._40_8_;
                            uStack_4fd0 = local_4cc0._48_8_;
                            uStack_4fc8 = local_4cc0._56_8_;
                            local_5400._8_8_ = (vfloat_impl<16> *)local_5180;
                            local_5400._0_8_ = &local_4e40;
                            _Stack_53f0._M_head_impl = (vfloat_impl<16> *)local_5140;
                            auStack_53e0 = auVar74._32_32_;
                            _Stack_53e8._M_head_impl = (vfloat_impl<16> *)&local_5100;
                            in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
                            std::
                            _Tuple_impl<0ul,embree::vfloat_impl<16>&,embree::vfloat_impl<16>&,embree::vfloat_impl<16>&,embree::Vec3<embree::vfloat_impl<16>>&>
                            ::
                            _M_assign<embree::vfloat_impl<16>,embree::vfloat_impl<16>,embree::vfloat_impl<16>,embree::Vec3<embree::vfloat_impl<16>>>
                                      ((_Tuple_impl<0UL,_embree::vfloat_impl<16>_&,_embree::vfloat_impl<16>_&,_embree::vfloat_impl<16>_&,_embree::Vec3<embree::vfloat_impl<16>_>_&>
                                        *)local_5400,
                                       (_Tuple_impl<0UL,_embree::vfloat_impl<16>,_embree::vfloat_impl<16>,_embree::vfloat_impl<16>,_embree::Vec3<embree::vfloat_impl<16>_>_>
                                        *)&local_50c0.field_0);
                            pRVar3 = context->user;
                            auVar70 = vpbroadcastd_avx512f();
                            auVar130 = vpbroadcastd_avx512f();
                            local_50c0._0_8_ = local_4e40;
                            local_50c0._8_8_ = uStack_4e38;
                            local_50c0._16_8_ = uStack_4e30;
                            local_50c0._24_8_ = uStack_4e28;
                            local_50c0._32_8_ = uStack_4e20;
                            local_50c0._40_8_ = uStack_4e18;
                            local_50c0._48_8_ = uStack_4e10;
                            local_50c0._56_8_ = uStack_4e08;
                            local_50c0._64_8_ = local_4e00;
                            local_50c0._72_8_ = uStack_4df8;
                            local_50c0._80_8_ = uStack_4df0;
                            local_50c0._88_8_ = uStack_4de8;
                            local_50c0._96_8_ = uStack_4de0;
                            local_50c0._104_8_ = uStack_4dd8;
                            local_50c0._112_8_ = uStack_4dd0;
                            local_50c0._120_8_ = uStack_4dc8;
                            local_50c0._128_8_ = local_4dc0;
                            local_50c0._136_8_ = uStack_4db8;
                            local_50c0._144_8_ = uStack_4db0;
                            local_50c0._152_8_ = uStack_4da8;
                            local_50c0._160_8_ = uStack_4da0;
                            local_50c0._168_8_ = uStack_4d98;
                            local_50c0._176_8_ = uStack_4d90;
                            local_50c0._184_8_ = uStack_4d88;
                            local_5000 = local_5100;
                            uStack_4ff8 = uStack_50f8;
                            uStack_4ff0 = uStack_50f0;
                            uStack_4fe8 = uStack_50e8;
                            uStack_4fe0 = uStack_50e0;
                            uStack_4fd8 = uStack_50d8;
                            uStack_4fd0 = uStack_50d0;
                            uStack_4fc8 = uStack_50c8;
                            local_4f80 = vmovdqa64_avx512f(auVar130);
                            local_4f40 = vmovdqa64_avx512f(auVar70);
                            auVar21 = vpcmpeqd_avx2(auVar70._0_32_,auVar70._0_32_);
                            local_5488[3] = auVar21;
                            local_5488[2] = auVar21;
                            local_5488[1] = auVar21;
                            *local_5488 = auVar21;
                            local_4f00 = vbroadcastss_avx512f(ZEXT416(pRVar3->instID[0]));
                            local_4ec0 = vbroadcastss_avx512f(ZEXT416(pRVar3->instPrimID[0]));
                            local_5340 = *(undefined1 (*) [64])(ray + 0x200);
                            auVar70 = vblendmps_avx512f(local_5340,local_5180);
                            bVar44 = (bool)((byte)uVar45 & 1);
                            bVar5 = (bool)((byte)(uVar45 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar45 >> 2) & 1);
                            bVar7 = (bool)((byte)(uVar45 >> 3) & 1);
                            bVar8 = (bool)((byte)(uVar45 >> 4) & 1);
                            bVar9 = (bool)((byte)(uVar45 >> 5) & 1);
                            bVar10 = (bool)((byte)(uVar45 >> 6) & 1);
                            bVar11 = (bool)((byte)(uVar45 >> 7) & 1);
                            bVar12 = (byte)(uVar45 >> 8);
                            bVar13 = (bool)(bVar12 >> 1 & 1);
                            bVar14 = (bool)(bVar12 >> 2 & 1);
                            bVar15 = (bool)(bVar12 >> 3 & 1);
                            bVar16 = (bool)(bVar12 >> 4 & 1);
                            bVar17 = (bool)(bVar12 >> 5 & 1);
                            bVar18 = (bool)(bVar12 >> 6 & 1);
                            *(uint *)(ray + 0x200) =
                                 (uint)bVar44 * auVar70._0_4_ | (uint)!bVar44 * local_4ec0._0_4_;
                            *(uint *)(ray + 0x204) =
                                 (uint)bVar5 * auVar70._4_4_ | (uint)!bVar5 * local_4ec0._4_4_;
                            *(uint *)(ray + 0x208) =
                                 (uint)bVar6 * auVar70._8_4_ | (uint)!bVar6 * local_4ec0._8_4_;
                            *(uint *)(ray + 0x20c) =
                                 (uint)bVar7 * auVar70._12_4_ | (uint)!bVar7 * local_4ec0._12_4_;
                            *(uint *)(ray + 0x210) =
                                 (uint)bVar8 * auVar70._16_4_ | (uint)!bVar8 * local_4ec0._16_4_;
                            *(uint *)(ray + 0x214) =
                                 (uint)bVar9 * auVar70._20_4_ | (uint)!bVar9 * local_4ec0._20_4_;
                            *(uint *)(ray + 0x218) =
                                 (uint)bVar10 * auVar70._24_4_ | (uint)!bVar10 * local_4ec0._24_4_;
                            *(uint *)(ray + 0x21c) =
                                 (uint)bVar11 * auVar70._28_4_ | (uint)!bVar11 * local_4ec0._28_4_;
                            *(uint *)(ray + 0x220) =
                                 (uint)(bVar12 & 1) * auVar70._32_4_ |
                                 (uint)!(bool)(bVar12 & 1) * local_4ec0._32_4_;
                            *(uint *)(ray + 0x224) =
                                 (uint)bVar13 * auVar70._36_4_ | (uint)!bVar13 * local_4ec0._36_4_;
                            *(uint *)(ray + 0x228) =
                                 (uint)bVar14 * auVar70._40_4_ | (uint)!bVar14 * local_4ec0._40_4_;
                            *(uint *)(ray + 0x22c) =
                                 (uint)bVar15 * auVar70._44_4_ | (uint)!bVar15 * local_4ec0._44_4_;
                            *(uint *)(ray + 0x230) =
                                 (uint)bVar16 * auVar70._48_4_ | (uint)!bVar16 * local_4ec0._48_4_;
                            *(uint *)(ray + 0x234) =
                                 (uint)bVar17 * auVar70._52_4_ | (uint)!bVar17 * local_4ec0._52_4_;
                            *(uint *)(ray + 0x238) =
                                 (uint)bVar18 * auVar70._56_4_ | (uint)!bVar18 * local_4ec0._56_4_;
                            *(uint *)(ray + 0x23c) =
                                 (uint)(bVar12 >> 7) * auVar70._60_4_ |
                                 (uint)!(bool)(bVar12 >> 7) * local_4ec0._60_4_;
                            auVar74 = vpmovm2d_avx512dq((ulong)uVar45);
                            _local_5400 = vmovdqa64_avx512f(auVar74);
                            local_5430.valid = (int *)local_5400;
                            local_5430.geometryUserPtr = pGVar2->userPtr;
                            local_5430.context = context->user;
                            local_5430.hit = (RTCHitN *)&local_50c0;
                            local_5430.N = 0x10;
                            local_5430.ray = (RTCRayN *)ray;
                            if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
                              (*pGVar2->occlusionFilterN)(&local_5430);
                              auVar74 = vmovdqa64_avx512f(_local_5400);
                            }
                            uVar22 = vptestmd_avx512f(auVar74,auVar74);
                            if ((short)uVar22 == 0) {
                              uVar67 = 0;
                              auVar70 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                              auVar72 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                              auVar69 = vxorps_avx512vl(auVar69,auVar69);
                              auVar73 = ZEXT1664(auVar69);
                              auVar71 = vbroadcastss_avx512f(ZEXT416(0x34000000));
                              auVar130 = vbroadcastss_avx512f(ZEXT416(0x80000000));
                            }
                            else {
                              p_Var4 = context->args->filter;
                              if (p_Var4 == (RTCFilterFunctionN)0x0) {
                                auVar70 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                                auVar72 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                                auVar69 = vxorps_avx512vl(auVar69,auVar69);
                                auVar73 = ZEXT1664(auVar69);
                                auVar71 = vbroadcastss_avx512f(ZEXT416(0x34000000));
                                auVar130 = vbroadcastss_avx512f(ZEXT416(0x80000000));
                              }
                              else {
                                auVar70 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                                auVar72 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                                auVar69 = vxorps_avx512vl(auVar69,auVar69);
                                auVar73 = ZEXT1664(auVar69);
                                auVar71 = vbroadcastss_avx512f(ZEXT416(0x34000000));
                                auVar130 = vbroadcastss_avx512f(ZEXT416(0x80000000));
                                if (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar2->field_8).field_0x2 & 0x40) != 0)) {
                                  in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
                                  (*p_Var4)(&local_5430);
                                  auVar130 = vbroadcastss_avx512f(ZEXT416(0x80000000));
                                  auVar71 = vbroadcastss_avx512f(ZEXT416(0x34000000));
                                  auVar69 = vxorps_avx512vl(auVar69,auVar69);
                                  auVar73 = ZEXT1664(auVar69);
                                  auVar72 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                                  auVar70 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                                  auVar74 = vmovdqa64_avx512f(_local_5400);
                                }
                              }
                              uVar67 = vptestmd_avx512f(auVar74,auVar74);
                              auVar74 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                              bVar44 = (bool)((byte)uVar67 & 1);
                              bVar5 = (bool)((byte)(uVar67 >> 1) & 1);
                              bVar6 = (bool)((byte)(uVar67 >> 2) & 1);
                              bVar7 = (bool)((byte)(uVar67 >> 3) & 1);
                              bVar8 = (bool)((byte)(uVar67 >> 4) & 1);
                              bVar9 = (bool)((byte)(uVar67 >> 5) & 1);
                              bVar10 = (bool)((byte)(uVar67 >> 6) & 1);
                              bVar11 = (bool)((byte)(uVar67 >> 7) & 1);
                              bVar13 = (bool)((byte)(uVar67 >> 8) & 1);
                              bVar14 = (bool)((byte)(uVar67 >> 9) & 1);
                              bVar15 = (bool)((byte)(uVar67 >> 10) & 1);
                              bVar16 = (bool)((byte)(uVar67 >> 0xb) & 1);
                              bVar17 = (bool)((byte)(uVar67 >> 0xc) & 1);
                              bVar18 = (bool)((byte)(uVar67 >> 0xd) & 1);
                              bVar19 = (bool)((byte)(uVar67 >> 0xe) & 1);
                              bVar20 = SUB81(uVar67 >> 0xf,0);
                              *(uint *)(local_5430.ray + 0x200) =
                                   (uint)bVar44 * auVar74._0_4_ |
                                   (uint)!bVar44 * *(int *)(local_5430.ray + 0x200);
                              *(uint *)(local_5430.ray + 0x204) =
                                   (uint)bVar5 * auVar74._4_4_ |
                                   (uint)!bVar5 * *(int *)(local_5430.ray + 0x204);
                              *(uint *)(local_5430.ray + 0x208) =
                                   (uint)bVar6 * auVar74._8_4_ |
                                   (uint)!bVar6 * *(int *)(local_5430.ray + 0x208);
                              *(uint *)(local_5430.ray + 0x20c) =
                                   (uint)bVar7 * auVar74._12_4_ |
                                   (uint)!bVar7 * *(int *)(local_5430.ray + 0x20c);
                              *(uint *)(local_5430.ray + 0x210) =
                                   (uint)bVar8 * auVar74._16_4_ |
                                   (uint)!bVar8 * *(int *)(local_5430.ray + 0x210);
                              *(uint *)(local_5430.ray + 0x214) =
                                   (uint)bVar9 * auVar74._20_4_ |
                                   (uint)!bVar9 * *(int *)(local_5430.ray + 0x214);
                              *(uint *)(local_5430.ray + 0x218) =
                                   (uint)bVar10 * auVar74._24_4_ |
                                   (uint)!bVar10 * *(int *)(local_5430.ray + 0x218);
                              *(uint *)(local_5430.ray + 0x21c) =
                                   (uint)bVar11 * auVar74._28_4_ |
                                   (uint)!bVar11 * *(int *)(local_5430.ray + 0x21c);
                              *(uint *)(local_5430.ray + 0x220) =
                                   (uint)bVar13 * auVar74._32_4_ |
                                   (uint)!bVar13 * *(int *)(local_5430.ray + 0x220);
                              *(uint *)(local_5430.ray + 0x224) =
                                   (uint)bVar14 * auVar74._36_4_ |
                                   (uint)!bVar14 * *(int *)(local_5430.ray + 0x224);
                              *(uint *)(local_5430.ray + 0x228) =
                                   (uint)bVar15 * auVar74._40_4_ |
                                   (uint)!bVar15 * *(int *)(local_5430.ray + 0x228);
                              *(uint *)(local_5430.ray + 0x22c) =
                                   (uint)bVar16 * auVar74._44_4_ |
                                   (uint)!bVar16 * *(int *)(local_5430.ray + 0x22c);
                              *(uint *)(local_5430.ray + 0x230) =
                                   (uint)bVar17 * auVar74._48_4_ |
                                   (uint)!bVar17 * *(int *)(local_5430.ray + 0x230);
                              *(uint *)(local_5430.ray + 0x234) =
                                   (uint)bVar18 * auVar74._52_4_ |
                                   (uint)!bVar18 * *(int *)(local_5430.ray + 0x234);
                              *(uint *)(local_5430.ray + 0x238) =
                                   (uint)bVar19 * auVar74._56_4_ |
                                   (uint)!bVar19 * *(int *)(local_5430.ray + 0x238);
                              *(uint *)(local_5430.ray + 0x23c) =
                                   (uint)bVar20 * auVar74._60_4_ |
                                   (uint)!bVar20 * *(int *)(local_5430.ray + 0x23c);
                            }
                            uVar45 = (ushort)uVar67;
                            bVar44 = (bool)((byte)uVar67 & 1);
                            bVar5 = (bool)((byte)(uVar67 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar67 >> 2) & 1);
                            bVar7 = (bool)((byte)(uVar67 >> 3) & 1);
                            bVar8 = (bool)((byte)(uVar67 >> 4) & 1);
                            bVar9 = (bool)((byte)(uVar67 >> 5) & 1);
                            bVar10 = (bool)((byte)(uVar67 >> 6) & 1);
                            bVar11 = (bool)((byte)(uVar67 >> 7) & 1);
                            bVar13 = (bool)((byte)(uVar67 >> 8) & 1);
                            bVar14 = (bool)((byte)(uVar67 >> 9) & 1);
                            bVar15 = (bool)((byte)(uVar67 >> 10) & 1);
                            bVar16 = (bool)((byte)(uVar67 >> 0xb) & 1);
                            bVar17 = (bool)((byte)(uVar67 >> 0xc) & 1);
                            bVar18 = (bool)((byte)(uVar67 >> 0xd) & 1);
                            bVar19 = (bool)((byte)(uVar67 >> 0xe) & 1);
                            bVar20 = SUB81(uVar67 >> 0xf,0);
                            *(uint *)pRVar1 =
                                 (uint)bVar44 * *(int *)pRVar1 | (uint)!bVar44 * local_5340._0_4_;
                            *(uint *)(ray + 0x204) =
                                 (uint)bVar5 * *(int *)(ray + 0x204) |
                                 (uint)!bVar5 * local_5340._4_4_;
                            *(uint *)(ray + 0x208) =
                                 (uint)bVar6 * *(int *)(ray + 0x208) |
                                 (uint)!bVar6 * local_5340._8_4_;
                            *(uint *)(ray + 0x20c) =
                                 (uint)bVar7 * *(int *)(ray + 0x20c) |
                                 (uint)!bVar7 * local_5340._12_4_;
                            *(uint *)(ray + 0x210) =
                                 (uint)bVar8 * *(int *)(ray + 0x210) |
                                 (uint)!bVar8 * local_5340._16_4_;
                            *(uint *)(ray + 0x214) =
                                 (uint)bVar9 * *(int *)(ray + 0x214) |
                                 (uint)!bVar9 * local_5340._20_4_;
                            *(uint *)(ray + 0x218) =
                                 (uint)bVar10 * *(int *)(ray + 0x218) |
                                 (uint)!bVar10 * local_5340._24_4_;
                            *(uint *)(ray + 0x21c) =
                                 (uint)bVar11 * *(int *)(ray + 0x21c) |
                                 (uint)!bVar11 * local_5340._28_4_;
                            *(uint *)(ray + 0x220) =
                                 (uint)bVar13 * *(int *)(ray + 0x220) |
                                 (uint)!bVar13 * local_5340._32_4_;
                            *(uint *)(ray + 0x224) =
                                 (uint)bVar14 * *(int *)(ray + 0x224) |
                                 (uint)!bVar14 * local_5340._36_4_;
                            *(uint *)(ray + 0x228) =
                                 (uint)bVar15 * *(int *)(ray + 0x228) |
                                 (uint)!bVar15 * local_5340._40_4_;
                            *(uint *)(ray + 0x22c) =
                                 (uint)bVar16 * *(int *)(ray + 0x22c) |
                                 (uint)!bVar16 * local_5340._44_4_;
                            *(uint *)(ray + 0x230) =
                                 (uint)bVar17 * *(int *)(ray + 0x230) |
                                 (uint)!bVar17 * local_5340._48_4_;
                            *(uint *)(ray + 0x234) =
                                 (uint)bVar18 * *(int *)(ray + 0x234) |
                                 (uint)!bVar18 * local_5340._52_4_;
                            *(uint *)(ray + 0x238) =
                                 (uint)bVar19 * *(int *)(ray + 0x238) |
                                 (uint)!bVar19 * local_5340._56_4_;
                            *(uint *)(ray + 0x23c) =
                                 (uint)bVar20 * *(int *)(ray + 0x23c) |
                                 (uint)!bVar20 * local_5340._60_4_;
                          }
                          uVar46 = uVar46 & (ushort)~uVar45;
                        }
                        lVar55 = lVar55 + 4;
                      } while ((short)uVar46 != 0);
                      uVar46 = 0;
LAB_01ebc675:
                      local_54b8 = local_54b8 + local_5368;
                      pGVar49 = pGVar49 + local_5368;
                      local_5450 = local_5450 + local_5368;
                      local_5458 = local_5458 + local_5368;
                      local_5468 = local_5468 + local_5368;
                      local_5478 = local_5478 + local_5368;
                      local_5460 = local_5460 + local_5368;
                      local_54b0 = local_54b0 + local_5368;
                      pGVar57 = pGVar57 + local_5368;
                      local_5448 = local_5448 + local_5368;
                      local_5438 = local_5438 + local_5368;
                      local_5440 = local_5440 + local_5368;
                      local_5470 = local_5470 + local_5368;
                      pGVar64 = pGVar64 + local_5368;
                      lVar55 = local_5358;
                    }
                    local_54cc = local_54cc & (uVar46 | uVar47);
                  }
                  local_54cc = ~local_54cc;
                  uVar48 = 0;
                  puVar56 = local_5370;
                  pauVar58 = local_5378;
                }
                else {
                  local_5498.super_Precalculations.grid =
                       *(GridSOA **)(root.ptr & 0xfffffffffffffff0);
                  uVar48 = *(ulong *)local_5498.super_Precalculations.grid;
                  local_54cc = 0;
                }
                local_54fc = local_54cc | local_54fc;
                if ((short)local_54fc == -1) {
                  local_54fc = 0xffff;
                  goto LAB_01ebc88f;
                }
                auVar74 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                bVar44 = (bool)((byte)local_54fc & 1);
                bVar5 = (bool)((byte)(local_54fc >> 1) & 1);
                bVar6 = (bool)((byte)(local_54fc >> 2) & 1);
                bVar7 = (bool)((byte)(local_54fc >> 3) & 1);
                bVar8 = (bool)((byte)(local_54fc >> 4) & 1);
                bVar9 = (bool)((byte)(local_54fc >> 5) & 1);
                bVar10 = (bool)((byte)(local_54fc >> 6) & 1);
                bVar11 = (bool)((byte)(local_54fc >> 7) & 1);
                bVar13 = (bool)((byte)(local_54fc >> 8) & 1);
                bVar14 = (bool)((byte)(local_54fc >> 9) & 1);
                bVar15 = (bool)((byte)(local_54fc >> 10) & 1);
                bVar16 = (bool)((byte)(local_54fc >> 0xb) & 1);
                bVar17 = (bool)((byte)(local_54fc >> 0xc) & 1);
                bVar18 = (bool)((byte)(local_54fc >> 0xd) & 1);
                bVar19 = (bool)((byte)(local_54fc >> 0xe) & 1);
                bVar20 = (bool)((byte)(local_54fc >> 0xf) & 1);
                local_44c0 = (uint)bVar44 * auVar74._0_4_ | !bVar44 * local_44c0;
                uStack_44bc = (uint)bVar5 * auVar74._4_4_ | !bVar5 * uStack_44bc;
                uStack_44b8 = (uint)bVar6 * auVar74._8_4_ | !bVar6 * uStack_44b8;
                uStack_44b4 = (uint)bVar7 * auVar74._12_4_ | !bVar7 * uStack_44b4;
                uStack_44b0 = (uint)bVar8 * auVar74._16_4_ | !bVar8 * uStack_44b0;
                uStack_44ac = (uint)bVar9 * auVar74._20_4_ | !bVar9 * uStack_44ac;
                uStack_44a8 = (uint)bVar10 * auVar74._24_4_ | !bVar10 * uStack_44a8;
                uStack_44a4 = (uint)bVar11 * auVar74._28_4_ | !bVar11 * uStack_44a4;
                uStack_44a0 = (uint)bVar13 * auVar74._32_4_ | !bVar13 * uStack_44a0;
                uStack_449c = (uint)bVar14 * auVar74._36_4_ | !bVar14 * uStack_449c;
                uStack_4498 = (uint)bVar15 * auVar74._40_4_ | !bVar15 * uStack_4498;
                uStack_4494 = (uint)bVar16 * auVar74._44_4_ | !bVar16 * uStack_4494;
                uStack_4490 = (uint)bVar17 * auVar74._48_4_ | !bVar17 * uStack_4490;
                uStack_448c = (uint)bVar18 * auVar74._52_4_ | !bVar18 * uStack_448c;
                uStack_4488 = (uint)bVar19 * auVar74._56_4_ | !bVar19 * uStack_4488;
                uStack_4484 = (uint)bVar20 * auVar74._60_4_ | !bVar20 * uStack_4484;
                if (uVar48 != 0) {
                  *puVar56 = uVar48;
                  puVar56 = puVar56 + 1;
                  auVar74 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                  *pauVar58 = auVar74;
                  pauVar58 = pauVar58 + 1;
                }
              }
              goto LAB_01ebae96;
            }
            auVar103._4_4_ = uStack_44bc;
            auVar103._0_4_ = local_44c0;
            auVar103._8_4_ = uStack_44b8;
            auVar103._12_4_ = uStack_44b4;
            auVar103._16_4_ = uStack_44b0;
            auVar103._20_4_ = uStack_44ac;
            auVar103._24_4_ = uStack_44a8;
            auVar103._28_4_ = uStack_44a4;
            auVar103._32_4_ = uStack_44a0;
            auVar103._36_4_ = uStack_449c;
            auVar103._40_4_ = uStack_4498;
            auVar103._44_4_ = uStack_4494;
            auVar103._48_4_ = uStack_4490;
            auVar103._52_4_ = uStack_448c;
            auVar103._56_4_ = uStack_4488;
            auVar103._60_4_ = uStack_4484;
            uVar48 = root.ptr & 0xfffffffffffffff0;
            root.ptr = 8;
            auVar74 = auVar72;
            for (lVar55 = -0x10;
                (lVar55 != 0 && (uVar67 = *(ulong *)(uVar48 + 0x20 + lVar55 * 2), uVar67 != 8));
                lVar55 = lVar55 + 4) {
              auVar76 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar48 + 0x90 + lVar55)));
              auVar75 = *(undefined1 (*) [64])(ray + 0x1c0);
              uVar60 = *(undefined4 *)(uVar48 + 0x30 + lVar55);
              auVar78._4_4_ = uVar60;
              auVar78._0_4_ = uVar60;
              auVar78._8_4_ = uVar60;
              auVar78._12_4_ = uVar60;
              auVar78._16_4_ = uVar60;
              auVar78._20_4_ = uVar60;
              auVar78._24_4_ = uVar60;
              auVar78._28_4_ = uVar60;
              auVar78._32_4_ = uVar60;
              auVar78._36_4_ = uVar60;
              auVar78._40_4_ = uVar60;
              auVar78._44_4_ = uVar60;
              auVar78._48_4_ = uVar60;
              auVar78._52_4_ = uVar60;
              auVar78._56_4_ = uVar60;
              auVar78._60_4_ = uVar60;
              auVar76 = vfmadd213ps_avx512f(auVar76,auVar75,auVar78);
              auVar77 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar48 + 0xb0 + lVar55)));
              uVar60 = *(undefined4 *)(uVar48 + 0x50 + lVar55);
              auVar79._4_4_ = uVar60;
              auVar79._0_4_ = uVar60;
              auVar79._8_4_ = uVar60;
              auVar79._12_4_ = uVar60;
              auVar79._16_4_ = uVar60;
              auVar79._20_4_ = uVar60;
              auVar79._24_4_ = uVar60;
              auVar79._28_4_ = uVar60;
              auVar79._32_4_ = uVar60;
              auVar79._36_4_ = uVar60;
              auVar79._40_4_ = uVar60;
              auVar79._44_4_ = uVar60;
              auVar79._48_4_ = uVar60;
              auVar79._52_4_ = uVar60;
              auVar79._56_4_ = uVar60;
              auVar79._60_4_ = uVar60;
              auVar77 = vfmadd213ps_avx512f(auVar77,auVar75,auVar79);
              auVar78 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar48 + 0xd0 + lVar55)));
              uVar60 = *(undefined4 *)(uVar48 + 0x70 + lVar55);
              auVar80._4_4_ = uVar60;
              auVar80._0_4_ = uVar60;
              auVar80._8_4_ = uVar60;
              auVar80._12_4_ = uVar60;
              auVar80._16_4_ = uVar60;
              auVar80._20_4_ = uVar60;
              auVar80._24_4_ = uVar60;
              auVar80._28_4_ = uVar60;
              auVar80._32_4_ = uVar60;
              auVar80._36_4_ = uVar60;
              auVar80._40_4_ = uVar60;
              auVar80._44_4_ = uVar60;
              auVar80._48_4_ = uVar60;
              auVar80._52_4_ = uVar60;
              auVar80._56_4_ = uVar60;
              auVar80._60_4_ = uVar60;
              auVar78 = vfmadd213ps_avx512f(auVar78,auVar75,auVar80);
              auVar79 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar48 + 0xa0 + lVar55)));
              uVar60 = *(undefined4 *)(uVar48 + 0x40 + lVar55);
              auVar81._4_4_ = uVar60;
              auVar81._0_4_ = uVar60;
              auVar81._8_4_ = uVar60;
              auVar81._12_4_ = uVar60;
              auVar81._16_4_ = uVar60;
              auVar81._20_4_ = uVar60;
              auVar81._24_4_ = uVar60;
              auVar81._28_4_ = uVar60;
              auVar81._32_4_ = uVar60;
              auVar81._36_4_ = uVar60;
              auVar81._40_4_ = uVar60;
              auVar81._44_4_ = uVar60;
              auVar81._48_4_ = uVar60;
              auVar81._52_4_ = uVar60;
              auVar81._56_4_ = uVar60;
              auVar81._60_4_ = uVar60;
              auVar79 = vfmadd213ps_avx512f(auVar79,auVar75,auVar81);
              auVar80 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar48 + 0xc0 + lVar55)));
              uVar60 = *(undefined4 *)(uVar48 + 0x60 + lVar55);
              auVar82._4_4_ = uVar60;
              auVar82._0_4_ = uVar60;
              auVar82._8_4_ = uVar60;
              auVar82._12_4_ = uVar60;
              auVar82._16_4_ = uVar60;
              auVar82._20_4_ = uVar60;
              auVar82._24_4_ = uVar60;
              auVar82._28_4_ = uVar60;
              auVar82._32_4_ = uVar60;
              auVar82._36_4_ = uVar60;
              auVar82._40_4_ = uVar60;
              auVar82._44_4_ = uVar60;
              auVar82._48_4_ = uVar60;
              auVar82._52_4_ = uVar60;
              auVar82._56_4_ = uVar60;
              auVar82._60_4_ = uVar60;
              auVar80 = vfmadd213ps_avx512f(auVar80,auVar75,auVar82);
              auVar81 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar48 + 0xe0 + lVar55)));
              uVar60 = *(undefined4 *)(uVar48 + 0x80 + lVar55);
              auVar83._4_4_ = uVar60;
              auVar83._0_4_ = uVar60;
              auVar83._8_4_ = uVar60;
              auVar83._12_4_ = uVar60;
              auVar83._16_4_ = uVar60;
              auVar83._20_4_ = uVar60;
              auVar83._24_4_ = uVar60;
              auVar83._28_4_ = uVar60;
              auVar83._32_4_ = uVar60;
              auVar83._36_4_ = uVar60;
              auVar83._40_4_ = uVar60;
              auVar83._44_4_ = uVar60;
              auVar83._48_4_ = uVar60;
              auVar83._52_4_ = uVar60;
              auVar83._56_4_ = uVar60;
              auVar83._60_4_ = uVar60;
              auVar81 = vfmadd213ps_avx512f(auVar81,auVar75,auVar83);
              auVar76 = vfmsub213ps_avx512f(auVar76,local_4740,local_4680);
              auVar77 = vfmsub213ps_avx512f(auVar77,local_4700,local_4640);
              auVar78 = vfmsub213ps_avx512f(auVar78,local_46c0,local_4600);
              auVar79 = vfmsub213ps_avx512f(auVar79,local_4740,local_4680);
              auVar80 = vfmsub213ps_avx512f(auVar80,local_4700,local_4640);
              auVar81 = vfmsub213ps_avx512f(auVar81,local_46c0,local_4600);
              auVar82 = vpminsd_avx512f(auVar76,auVar79);
              auVar83 = vpminsd_avx512f(auVar77,auVar80);
              auVar82 = vpmaxsd_avx512f(auVar82,auVar83);
              auVar83 = vpminsd_avx512f(auVar78,auVar81);
              auVar82 = vpmaxsd_avx512f(auVar82,auVar83);
              auVar76 = vpmaxsd_avx512f(auVar76,auVar79);
              auVar77 = vpmaxsd_avx512f(auVar77,auVar80);
              auVar76 = vpminsd_avx512f(auVar76,auVar77);
              auVar77 = vpmaxsd_avx512f(auVar78,auVar81);
              auVar76 = vpminsd_avx512f(auVar76,auVar77);
              auVar84._4_4_ = uStack_44fc;
              auVar84._0_4_ = local_4500;
              auVar84._8_4_ = uStack_44f8;
              auVar84._12_4_ = uStack_44f4;
              auVar84._16_4_ = uStack_44f0;
              auVar84._20_4_ = uStack_44ec;
              auVar84._24_4_ = uStack_44e8;
              auVar84._28_4_ = uStack_44e4;
              auVar84._32_4_ = uStack_44e0;
              auVar84._36_4_ = uStack_44dc;
              auVar84._40_4_ = uStack_44d8;
              auVar84._44_4_ = uStack_44d4;
              auVar84._48_4_ = uStack_44d0;
              auVar84._52_4_ = uStack_44cc;
              auVar84._56_4_ = uStack_44c8;
              auVar84._60_4_ = uStack_44c4;
              auVar77 = vpmaxsd_avx512f(auVar82,auVar84);
              auVar85._4_4_ = uStack_44bc;
              auVar85._0_4_ = local_44c0;
              auVar85._8_4_ = uStack_44b8;
              auVar85._12_4_ = uStack_44b4;
              auVar85._16_4_ = uStack_44b0;
              auVar85._20_4_ = uStack_44ac;
              auVar85._24_4_ = uStack_44a8;
              auVar85._28_4_ = uStack_44a4;
              auVar85._32_4_ = uStack_44a0;
              auVar85._36_4_ = uStack_449c;
              auVar85._40_4_ = uStack_4498;
              auVar85._44_4_ = uStack_4494;
              auVar85._48_4_ = uStack_4490;
              auVar85._52_4_ = uStack_448c;
              auVar85._56_4_ = uStack_4488;
              auVar85._60_4_ = uStack_4484;
              auVar76 = vpminsd_avx512f(auVar76,auVar85);
              uVar66 = vcmpps_avx512f(auVar77,auVar76,2);
              if ((uVar51 & 7) == 6) {
                uVar60 = *(undefined4 *)(uVar48 + 0xf0 + lVar55);
                auVar86._4_4_ = uVar60;
                auVar86._0_4_ = uVar60;
                auVar86._8_4_ = uVar60;
                auVar86._12_4_ = uVar60;
                auVar86._16_4_ = uVar60;
                auVar86._20_4_ = uVar60;
                auVar86._24_4_ = uVar60;
                auVar86._28_4_ = uVar60;
                auVar86._32_4_ = uVar60;
                auVar86._36_4_ = uVar60;
                auVar86._40_4_ = uVar60;
                auVar86._44_4_ = uVar60;
                auVar86._48_4_ = uVar60;
                auVar86._52_4_ = uVar60;
                auVar86._56_4_ = uVar60;
                auVar86._60_4_ = uVar60;
                uVar53 = vcmpps_avx512f(auVar75,auVar86,0xd);
                uVar60 = *(undefined4 *)(uVar48 + 0x100 + lVar55);
                auVar87._4_4_ = uVar60;
                auVar87._0_4_ = uVar60;
                auVar87._8_4_ = uVar60;
                auVar87._12_4_ = uVar60;
                auVar87._16_4_ = uVar60;
                auVar87._20_4_ = uVar60;
                auVar87._24_4_ = uVar60;
                auVar87._28_4_ = uVar60;
                auVar87._32_4_ = uVar60;
                auVar87._36_4_ = uVar60;
                auVar87._40_4_ = uVar60;
                auVar87._44_4_ = uVar60;
                auVar87._48_4_ = uVar60;
                auVar87._52_4_ = uVar60;
                auVar87._56_4_ = uVar60;
                auVar87._60_4_ = uVar60;
                uVar61 = vcmpps_avx512f(auVar75,auVar87,1);
                uVar66 = uVar66 & uVar53 & uVar61;
              }
              uVar53 = vcmpps_avx512f(auVar103,local_5300,6);
              uVar66 = uVar66 & uVar53;
              uVar53 = root.ptr;
              auVar88 = auVar74;
              if ((short)uVar66 != 0) {
                auVar76 = vblendmps_avx512f(auVar72,auVar82);
                bVar44 = (bool)((byte)uVar66 & 1);
                auVar88._0_4_ = (uint)bVar44 * auVar76._0_4_ | (uint)!bVar44 * auVar75._0_4_;
                bVar44 = (bool)((byte)(uVar66 >> 1) & 1);
                auVar88._4_4_ = (uint)bVar44 * auVar76._4_4_ | (uint)!bVar44 * auVar75._4_4_;
                bVar44 = (bool)((byte)(uVar66 >> 2) & 1);
                auVar88._8_4_ = (uint)bVar44 * auVar76._8_4_ | (uint)!bVar44 * auVar75._8_4_;
                bVar44 = (bool)((byte)(uVar66 >> 3) & 1);
                auVar88._12_4_ = (uint)bVar44 * auVar76._12_4_ | (uint)!bVar44 * auVar75._12_4_;
                bVar44 = (bool)((byte)(uVar66 >> 4) & 1);
                auVar88._16_4_ = (uint)bVar44 * auVar76._16_4_ | (uint)!bVar44 * auVar75._16_4_;
                bVar44 = (bool)((byte)(uVar66 >> 5) & 1);
                auVar88._20_4_ = (uint)bVar44 * auVar76._20_4_ | (uint)!bVar44 * auVar75._20_4_;
                bVar44 = (bool)((byte)(uVar66 >> 6) & 1);
                auVar88._24_4_ = (uint)bVar44 * auVar76._24_4_ | (uint)!bVar44 * auVar75._24_4_;
                bVar44 = (bool)((byte)(uVar66 >> 7) & 1);
                auVar88._28_4_ = (uint)bVar44 * auVar76._28_4_ | (uint)!bVar44 * auVar75._28_4_;
                bVar44 = (bool)((byte)(uVar66 >> 8) & 1);
                auVar88._32_4_ = (uint)bVar44 * auVar76._32_4_ | (uint)!bVar44 * auVar75._32_4_;
                bVar44 = (bool)((byte)(uVar66 >> 9) & 1);
                auVar88._36_4_ = (uint)bVar44 * auVar76._36_4_ | (uint)!bVar44 * auVar75._36_4_;
                bVar44 = (bool)((byte)(uVar66 >> 10) & 1);
                auVar88._40_4_ = (uint)bVar44 * auVar76._40_4_ | (uint)!bVar44 * auVar75._40_4_;
                bVar44 = (bool)((byte)(uVar66 >> 0xb) & 1);
                auVar88._44_4_ = (uint)bVar44 * auVar76._44_4_ | (uint)!bVar44 * auVar75._44_4_;
                bVar44 = (bool)((byte)(uVar66 >> 0xc) & 1);
                auVar88._48_4_ = (uint)bVar44 * auVar76._48_4_ | (uint)!bVar44 * auVar75._48_4_;
                bVar44 = (bool)((byte)(uVar66 >> 0xd) & 1);
                auVar88._52_4_ = (uint)bVar44 * auVar76._52_4_ | (uint)!bVar44 * auVar75._52_4_;
                bVar44 = (bool)((byte)(uVar66 >> 0xe) & 1);
                auVar88._56_4_ = (uint)bVar44 * auVar76._56_4_ | (uint)!bVar44 * auVar75._56_4_;
                bVar44 = SUB81(uVar66 >> 0xf,0);
                auVar88._60_4_ = (uint)bVar44 * auVar76._60_4_ | (uint)!bVar44 * auVar75._60_4_;
                uVar53 = uVar67;
                if (root.ptr != 8) {
                  *puVar56 = root.ptr;
                  puVar56 = puVar56 + 1;
                  *pauVar58 = auVar74;
                  pauVar58 = pauVar58 + 1;
                }
              }
              auVar74 = auVar88;
              root.ptr = uVar53;
              in_ZMM11 = local_46c0;
            }
            if (root.ptr == 8) goto LAB_01ebb0c7;
            auVar89._4_4_ = uStack_44bc;
            auVar89._0_4_ = local_44c0;
            auVar89._8_4_ = uStack_44b8;
            auVar89._12_4_ = uStack_44b4;
            auVar89._16_4_ = uStack_44b0;
            auVar89._20_4_ = uStack_44ac;
            auVar89._24_4_ = uStack_44a8;
            auVar89._28_4_ = uStack_44a4;
            auVar89._32_4_ = uStack_44a0;
            auVar89._36_4_ = uStack_449c;
            auVar89._40_4_ = uStack_4498;
            auVar89._44_4_ = uStack_4494;
            auVar89._48_4_ = uStack_4490;
            auVar89._52_4_ = uStack_448c;
            auVar89._56_4_ = uStack_4488;
            auVar89._60_4_ = uStack_4484;
            uVar22 = vcmpps_avx512f(auVar74,auVar89,9);
            local_54c8 = (ushort)uVar42;
            local_5300 = auVar74;
          } while (local_54c8 < (ushort)POPCOUNT((int)uVar22));
          *puVar56 = root.ptr;
          puVar56 = puVar56 + 1;
          *pauVar58 = auVar74;
          pauVar58 = pauVar58 + 1;
LAB_01ebb0c7:
          iVar68 = 4;
        }
        else {
          while (uVar48 != 0) {
            k = 0;
            for (uVar67 = uVar48; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
              k = k + 1;
            }
            local_5340._0_8_ = k;
            uVar48 = uVar48 - 1 & uVar48;
            in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
            bVar44 = occluded1(local_5380,local_5388,root,k,&local_5498,ray,
                               (TravRayK<16,_false> *)&local_48c0.field_0,context);
            auVar130 = vbroadcastss_avx512f(ZEXT416(0x80000000));
            auVar71 = vbroadcastss_avx512f(ZEXT416(0x34000000));
            auVar72 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
            uVar51 = 1 << (local_5340._0_4_ & 0x1f);
            if (!bVar44) {
              uVar51 = 0;
            }
            local_54fc = local_54fc | uVar51;
          }
          iVar68 = 3;
          if ((short)local_54fc != -1) {
            auVar70 = vbroadcastss_avx512f(ZEXT416(0xff800000));
            bVar44 = (bool)((byte)local_54fc & 1);
            bVar5 = (bool)((byte)(local_54fc >> 1) & 1);
            bVar6 = (bool)((byte)(local_54fc >> 2) & 1);
            bVar7 = (bool)((byte)(local_54fc >> 3) & 1);
            bVar8 = (bool)((byte)(local_54fc >> 4) & 1);
            bVar9 = (bool)((byte)(local_54fc >> 5) & 1);
            bVar10 = (bool)((byte)(local_54fc >> 6) & 1);
            bVar11 = (bool)((byte)(local_54fc >> 7) & 1);
            bVar13 = (bool)((byte)(local_54fc >> 8) & 1);
            bVar14 = (bool)((byte)(local_54fc >> 9) & 1);
            bVar15 = (bool)((byte)(local_54fc >> 10) & 1);
            bVar16 = (bool)((byte)(local_54fc >> 0xb) & 1);
            bVar17 = (bool)((byte)(local_54fc >> 0xc) & 1);
            bVar18 = (bool)((byte)(local_54fc >> 0xd) & 1);
            bVar19 = (bool)((byte)(local_54fc >> 0xe) & 1);
            bVar20 = (bool)((byte)(local_54fc >> 0xf) & 1);
            local_44c0 = (uint)bVar44 * auVar70._0_4_ | !bVar44 * local_44c0;
            uStack_44bc = (uint)bVar5 * auVar70._4_4_ | !bVar5 * uStack_44bc;
            uStack_44b8 = (uint)bVar6 * auVar70._8_4_ | !bVar6 * uStack_44b8;
            uStack_44b4 = (uint)bVar7 * auVar70._12_4_ | !bVar7 * uStack_44b4;
            uStack_44b0 = (uint)bVar8 * auVar70._16_4_ | !bVar8 * uStack_44b0;
            uStack_44ac = (uint)bVar9 * auVar70._20_4_ | !bVar9 * uStack_44ac;
            uStack_44a8 = (uint)bVar10 * auVar70._24_4_ | !bVar10 * uStack_44a8;
            uStack_44a4 = (uint)bVar11 * auVar70._28_4_ | !bVar11 * uStack_44a4;
            uStack_44a0 = (uint)bVar13 * auVar70._32_4_ | !bVar13 * uStack_44a0;
            uStack_449c = (uint)bVar14 * auVar70._36_4_ | !bVar14 * uStack_449c;
            uStack_4498 = (uint)bVar15 * auVar70._40_4_ | !bVar15 * uStack_4498;
            uStack_4494 = (uint)bVar16 * auVar70._44_4_ | !bVar16 * uStack_4494;
            uStack_4490 = (uint)bVar17 * auVar70._48_4_ | !bVar17 * uStack_4490;
            uStack_448c = (uint)bVar18 * auVar70._52_4_ | !bVar18 * uStack_448c;
            uStack_4488 = (uint)bVar19 * auVar70._56_4_ | !bVar19 * uStack_4488;
            uStack_4484 = (uint)bVar20 * auVar70._60_4_ | !bVar20 * uStack_4484;
            iVar68 = 2;
          }
          auVar70 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
          auVar69 = vxorps_avx512vl(auVar73._0_16_,auVar73._0_16_);
          auVar73 = ZEXT1664(auVar69);
          if (uVar42 < (uint)POPCOUNT(uVar60)) goto LAB_01ebaed9;
        }
      } while ((iVar68 == 4) || (iVar68 == 2));
LAB_01ebc88f:
      local_54fc = local_54fc & (uint)uVar65;
      auVar70 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      bVar44 = (bool)((byte)local_54fc & 1);
      bVar5 = (bool)((byte)(local_54fc >> 1) & 1);
      bVar6 = (bool)((byte)(local_54fc >> 2) & 1);
      bVar7 = (bool)((byte)(local_54fc >> 3) & 1);
      bVar8 = (bool)((byte)(local_54fc >> 4) & 1);
      bVar9 = (bool)((byte)(local_54fc >> 5) & 1);
      bVar10 = (bool)((byte)(local_54fc >> 6) & 1);
      bVar11 = (bool)((byte)(local_54fc >> 7) & 1);
      bVar13 = (bool)((byte)(local_54fc >> 8) & 1);
      bVar14 = (bool)((byte)(local_54fc >> 9) & 1);
      bVar15 = (bool)((byte)(local_54fc >> 10) & 1);
      bVar16 = (bool)((byte)(local_54fc >> 0xb) & 1);
      bVar17 = (bool)((byte)(local_54fc >> 0xc) & 1);
      bVar18 = (bool)((byte)(local_54fc >> 0xd) & 1);
      bVar19 = (bool)((byte)(local_54fc >> 0xe) & 1);
      bVar20 = (bool)((byte)(local_54fc >> 0xf) & 1);
      *(uint *)pRVar1 = (uint)bVar44 * auVar70._0_4_ | (uint)!bVar44 * *(int *)pRVar1;
      *(uint *)(ray + 0x204) = (uint)bVar5 * auVar70._4_4_ | (uint)!bVar5 * *(int *)(ray + 0x204);
      *(uint *)(ray + 0x208) = (uint)bVar6 * auVar70._8_4_ | (uint)!bVar6 * *(int *)(ray + 0x208);
      *(uint *)(ray + 0x20c) = (uint)bVar7 * auVar70._12_4_ | (uint)!bVar7 * *(int *)(ray + 0x20c);
      *(uint *)(ray + 0x210) = (uint)bVar8 * auVar70._16_4_ | (uint)!bVar8 * *(int *)(ray + 0x210);
      *(uint *)(ray + 0x214) = (uint)bVar9 * auVar70._20_4_ | (uint)!bVar9 * *(int *)(ray + 0x214);
      *(uint *)(ray + 0x218) = (uint)bVar10 * auVar70._24_4_ | (uint)!bVar10 * *(int *)(ray + 0x218)
      ;
      *(uint *)(ray + 0x21c) = (uint)bVar11 * auVar70._28_4_ | (uint)!bVar11 * *(int *)(ray + 0x21c)
      ;
      *(uint *)(ray + 0x220) = (uint)bVar13 * auVar70._32_4_ | (uint)!bVar13 * *(int *)(ray + 0x220)
      ;
      *(uint *)(ray + 0x224) = (uint)bVar14 * auVar70._36_4_ | (uint)!bVar14 * *(int *)(ray + 0x224)
      ;
      *(uint *)(ray + 0x228) = (uint)bVar15 * auVar70._40_4_ | (uint)!bVar15 * *(int *)(ray + 0x228)
      ;
      *(uint *)(ray + 0x22c) = (uint)bVar16 * auVar70._44_4_ | (uint)!bVar16 * *(int *)(ray + 0x22c)
      ;
      *(uint *)(ray + 0x230) = (uint)bVar17 * auVar70._48_4_ | (uint)!bVar17 * *(int *)(ray + 0x230)
      ;
      *(uint *)(ray + 0x234) = (uint)bVar18 * auVar70._52_4_ | (uint)!bVar18 * *(int *)(ray + 0x234)
      ;
      *(uint *)(ray + 0x238) = (uint)bVar19 * auVar70._56_4_ | (uint)!bVar19 * *(int *)(ray + 0x238)
      ;
      *(uint *)(ray + 0x23c) = (uint)bVar20 * auVar70._60_4_ | (uint)!bVar20 * *(int *)(ray + 0x23c)
      ;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }